

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  byte bVar70;
  byte bVar71;
  ulong uVar72;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  ulong uVar73;
  ulong uVar74;
  byte bVar75;
  byte bVar76;
  long lVar77;
  bool bVar78;
  bool bVar79;
  uint uVar80;
  undefined1 auVar90 [16];
  uint uVar139;
  uint uVar140;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  uint uVar141;
  uint uVar145;
  undefined1 auVar131 [32];
  undefined1 auVar89 [16];
  undefined1 auVar132 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float pp;
  float fVar146;
  undefined4 uVar147;
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar209;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar191;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  float fVar207;
  float fVar208;
  undefined1 auVar206 [64];
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar230;
  float fVar231;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar233;
  undefined1 auVar232 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  float fVar241;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar242 [64];
  float fVar247;
  undefined1 auVar248 [64];
  float fVar251;
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  ulong local_8c8;
  ulong local_8c0;
  uint local_8b4;
  uint local_8b0;
  undefined4 local_8ac;
  float local_8a8;
  float local_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_870 [16];
  Primitive *local_860;
  ulong local_858;
  RTCFilterFunctionNArguments local_850;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  RTCHitN local_660 [16];
  undefined1 auStack_650 [16];
  undefined4 local_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  uint local_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  uint uStack_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte local_180 [32];
  undefined1 auStack_160 [32];
  float local_140 [2];
  uint local_138 [66];
  undefined1 auVar125 [32];
  undefined1 auVar133 [32];
  undefined1 auVar136 [32];
  undefined1 auVar255 [64];
  undefined1 auVar257 [64];
  
  PVar2 = prim[1];
  uVar74 = (ulong)(byte)PVar2;
  fVar241 = *(float *)(prim + uVar74 * 0x19 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar88 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar89 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + uVar74 * 0x19 + 6));
  fVar210 = fVar241 * auVar89._0_4_;
  fVar146 = fVar241 * auVar88._0_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar74 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar83);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar74 * 5 + 6);
  auVar95 = vpmovsxbd_avx2(auVar84);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar74 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar85);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar98 = vpmovsxbd_avx2(auVar1);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar99 = vpmovsxbd_avx2(auVar81);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar74 + 6);
  auVar100 = vpmovsxbd_avx2(auVar220);
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar72 = (ulong)(uint)((int)(uVar74 * 9) * 2);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar72 + 6);
  auVar101 = vpmovsxbd_avx2(auVar86);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar72 + uVar74 + 6);
  auVar104 = vpmovsxbd_avx2(auVar82);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar102 = vcvtdq2ps_avx(auVar104);
  uVar73 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar93 = vpmovsxbd_avx2(auVar87);
  auVar103 = vcvtdq2ps_avx(auVar93);
  auVar112._4_4_ = fVar146;
  auVar112._0_4_ = fVar146;
  auVar112._8_4_ = fVar146;
  auVar112._12_4_ = fVar146;
  auVar112._16_4_ = fVar146;
  auVar112._20_4_ = fVar146;
  auVar112._24_4_ = fVar146;
  auVar112._28_4_ = fVar146;
  auVar114._8_4_ = 1;
  auVar114._0_8_ = 0x100000001;
  auVar114._12_4_ = 1;
  auVar114._16_4_ = 1;
  auVar114._20_4_ = 1;
  auVar114._24_4_ = 1;
  auVar114._28_4_ = 1;
  auVar105 = ZEXT1632(CONCAT412(fVar241 * auVar88._12_4_,
                                CONCAT48(fVar241 * auVar88._8_4_,
                                         CONCAT44(fVar241 * auVar88._4_4_,fVar146))));
  auVar94 = vpermps_avx2(auVar114,auVar105);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar92 = vpermps_avx512vl(auVar91,auVar105);
  fVar146 = auVar92._0_4_;
  fVar243 = auVar92._4_4_;
  auVar105._4_4_ = fVar243 * auVar97._4_4_;
  auVar105._0_4_ = fVar146 * auVar97._0_4_;
  fVar244 = auVar92._8_4_;
  auVar105._8_4_ = fVar244 * auVar97._8_4_;
  fVar245 = auVar92._12_4_;
  auVar105._12_4_ = fVar245 * auVar97._12_4_;
  fVar236 = auVar92._16_4_;
  auVar105._16_4_ = fVar236 * auVar97._16_4_;
  fVar237 = auVar92._20_4_;
  auVar105._20_4_ = fVar237 * auVar97._20_4_;
  fVar246 = auVar92._24_4_;
  auVar105._24_4_ = fVar246 * auVar97._24_4_;
  auVar105._28_4_ = auVar104._28_4_;
  auVar104._4_4_ = auVar100._4_4_ * fVar243;
  auVar104._0_4_ = auVar100._0_4_ * fVar146;
  auVar104._8_4_ = auVar100._8_4_ * fVar244;
  auVar104._12_4_ = auVar100._12_4_ * fVar245;
  auVar104._16_4_ = auVar100._16_4_ * fVar236;
  auVar104._20_4_ = auVar100._20_4_ * fVar237;
  auVar104._24_4_ = auVar100._24_4_ * fVar246;
  auVar104._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar103._4_4_ * fVar243;
  auVar93._0_4_ = auVar103._0_4_ * fVar146;
  auVar93._8_4_ = auVar103._8_4_ * fVar244;
  auVar93._12_4_ = auVar103._12_4_ * fVar245;
  auVar93._16_4_ = auVar103._16_4_ * fVar236;
  auVar93._20_4_ = auVar103._20_4_ * fVar237;
  auVar93._24_4_ = auVar103._24_4_ * fVar246;
  auVar93._28_4_ = auVar92._28_4_;
  auVar83 = vfmadd231ps_fma(auVar105,auVar94,auVar95);
  auVar84 = vfmadd231ps_fma(auVar104,auVar94,auVar99);
  auVar85 = vfmadd231ps_fma(auVar93,auVar102,auVar94);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar112,auVar96);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar112,auVar98);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar101,auVar112);
  auVar113._4_4_ = fVar210;
  auVar113._0_4_ = fVar210;
  auVar113._8_4_ = fVar210;
  auVar113._12_4_ = fVar210;
  auVar113._16_4_ = fVar210;
  auVar113._20_4_ = fVar210;
  auVar113._24_4_ = fVar210;
  auVar113._28_4_ = fVar210;
  auVar93 = ZEXT1632(CONCAT412(fVar241 * auVar89._12_4_,
                               CONCAT48(fVar241 * auVar89._8_4_,
                                        CONCAT44(fVar241 * auVar89._4_4_,fVar210))));
  auVar104 = vpermps_avx2(auVar114,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  auVar94 = vmulps_avx512vl(auVar93,auVar97);
  auVar107._0_4_ = auVar93._0_4_ * auVar100._0_4_;
  auVar107._4_4_ = auVar93._4_4_ * auVar100._4_4_;
  auVar107._8_4_ = auVar93._8_4_ * auVar100._8_4_;
  auVar107._12_4_ = auVar93._12_4_ * auVar100._12_4_;
  auVar107._16_4_ = auVar93._16_4_ * auVar100._16_4_;
  auVar107._20_4_ = auVar93._20_4_ * auVar100._20_4_;
  auVar107._24_4_ = auVar93._24_4_ * auVar100._24_4_;
  auVar107._28_4_ = 0;
  auVar100._4_4_ = auVar93._4_4_ * auVar103._4_4_;
  auVar100._0_4_ = auVar93._0_4_ * auVar103._0_4_;
  auVar100._8_4_ = auVar93._8_4_ * auVar103._8_4_;
  auVar100._12_4_ = auVar93._12_4_ * auVar103._12_4_;
  auVar100._16_4_ = auVar93._16_4_ * auVar103._16_4_;
  auVar100._20_4_ = auVar93._20_4_ * auVar103._20_4_;
  auVar100._24_4_ = auVar93._24_4_ * auVar103._24_4_;
  auVar100._28_4_ = auVar97._28_4_;
  auVar95 = vfmadd231ps_avx512vl(auVar94,auVar104,auVar95);
  auVar1 = vfmadd231ps_fma(auVar107,auVar104,auVar99);
  auVar81 = vfmadd231ps_fma(auVar100,auVar104,auVar102);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar113,auVar96);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar113,auVar98);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar113,auVar101);
  auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar259 = ZEXT3264(auVar96);
  vandps_avx512vl(ZEXT1632(auVar83),auVar96);
  auVar109._8_4_ = 0x219392ef;
  auVar109._0_8_ = 0x219392ef219392ef;
  auVar109._12_4_ = 0x219392ef;
  auVar109._16_4_ = 0x219392ef;
  auVar109._20_4_ = 0x219392ef;
  auVar109._24_4_ = 0x219392ef;
  auVar109._28_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar96,auVar109,1);
  bVar79 = (bool)((byte)uVar72 & 1);
  auVar94._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar83._0_4_;
  bVar79 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar83._4_4_;
  bVar79 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar83._8_4_;
  bVar79 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar83._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar84),auVar96);
  uVar72 = vcmpps_avx512vl(auVar94,auVar109,1);
  bVar79 = (bool)((byte)uVar72 & 1);
  auVar91._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._0_4_;
  bVar79 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._4_4_;
  bVar79 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._8_4_;
  bVar79 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar85),auVar96);
  uVar72 = vcmpps_avx512vl(auVar91,auVar109,1);
  bVar79 = (bool)((byte)uVar72 & 1);
  auVar96._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._0_4_;
  bVar79 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._4_4_;
  bVar79 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._8_4_;
  bVar79 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar97 = vrcp14ps_avx512vl(auVar94);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = &DAT_3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar111._16_4_ = 0x3f800000;
  auVar111._20_4_ = 0x3f800000;
  auVar111._24_4_ = 0x3f800000;
  auVar111._28_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar94,auVar97,auVar111);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar91);
  auVar84 = vfnmadd213ps_fma(auVar91,auVar97,auVar111);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar96);
  auVar85 = vfnmadd213ps_fma(auVar96,auVar97,auVar111);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar97,auVar97);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar97 = vsubps_avx512vl(auVar96,auVar95);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 9 + 6));
  auVar101._4_4_ = auVar83._4_4_ * auVar97._4_4_;
  auVar101._0_4_ = auVar83._0_4_ * auVar97._0_4_;
  auVar101._8_4_ = auVar83._8_4_ * auVar97._8_4_;
  auVar101._12_4_ = auVar83._12_4_ * auVar97._12_4_;
  auVar101._16_4_ = auVar97._16_4_ * 0.0;
  auVar101._20_4_ = auVar97._20_4_ * 0.0;
  auVar101._24_4_ = auVar97._24_4_ * 0.0;
  auVar101._28_4_ = auVar97._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx512vl(auVar96,auVar95);
  auVar108._0_4_ = auVar83._0_4_ * auVar96._0_4_;
  auVar108._4_4_ = auVar83._4_4_ * auVar96._4_4_;
  auVar108._8_4_ = auVar83._8_4_ * auVar96._8_4_;
  auVar108._12_4_ = auVar83._12_4_ * auVar96._12_4_;
  auVar108._16_4_ = auVar96._16_4_ * 0.0;
  auVar108._20_4_ = auVar96._20_4_ * 0.0;
  auVar108._24_4_ = auVar96._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar74 * -2 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar1));
  auVar102._4_4_ = auVar84._4_4_ * auVar96._4_4_;
  auVar102._0_4_ = auVar84._0_4_ * auVar96._0_4_;
  auVar102._8_4_ = auVar84._8_4_ * auVar96._8_4_;
  auVar102._12_4_ = auVar84._12_4_ * auVar96._12_4_;
  auVar102._16_4_ = auVar96._16_4_ * 0.0;
  auVar102._20_4_ = auVar96._20_4_ * 0.0;
  auVar102._24_4_ = auVar96._24_4_ * 0.0;
  auVar102._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar95);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar1));
  auVar106._0_4_ = auVar84._0_4_ * auVar96._0_4_;
  auVar106._4_4_ = auVar84._4_4_ * auVar96._4_4_;
  auVar106._8_4_ = auVar84._8_4_ * auVar96._8_4_;
  auVar106._12_4_ = auVar84._12_4_ * auVar96._12_4_;
  auVar106._16_4_ = auVar96._16_4_ * 0.0;
  auVar106._20_4_ = auVar96._20_4_ * 0.0;
  auVar106._24_4_ = auVar96._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar74 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar81));
  auVar103._4_4_ = auVar96._4_4_ * auVar85._4_4_;
  auVar103._0_4_ = auVar96._0_4_ * auVar85._0_4_;
  auVar103._8_4_ = auVar96._8_4_ * auVar85._8_4_;
  auVar103._12_4_ = auVar96._12_4_ * auVar85._12_4_;
  auVar103._16_4_ = auVar96._16_4_ * 0.0;
  auVar103._20_4_ = auVar96._20_4_ * 0.0;
  auVar103._24_4_ = auVar96._24_4_ * 0.0;
  auVar103._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar81));
  auVar92._0_4_ = auVar85._0_4_ * auVar96._0_4_;
  auVar92._4_4_ = auVar85._4_4_ * auVar96._4_4_;
  auVar92._8_4_ = auVar85._8_4_ * auVar96._8_4_;
  auVar92._12_4_ = auVar85._12_4_ * auVar96._12_4_;
  auVar92._16_4_ = auVar96._16_4_ * 0.0;
  auVar92._20_4_ = auVar96._20_4_ * 0.0;
  auVar92._24_4_ = auVar96._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar101,auVar108);
  auVar95 = vpminsd_avx2(auVar102,auVar106);
  auVar96 = vmaxps_avx(auVar96,auVar95);
  auVar95 = vpminsd_avx2(auVar103,auVar92);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar97._4_4_ = uVar147;
  auVar97._0_4_ = uVar147;
  auVar97._8_4_ = uVar147;
  auVar97._12_4_ = uVar147;
  auVar97._16_4_ = uVar147;
  auVar97._20_4_ = uVar147;
  auVar97._24_4_ = uVar147;
  auVar97._28_4_ = uVar147;
  auVar95 = vmaxps_avx512vl(auVar95,auVar97);
  auVar96 = vmaxps_avx(auVar96,auVar95);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  auVar95._16_4_ = 0x3f7ffffa;
  auVar95._20_4_ = 0x3f7ffffa;
  auVar95._24_4_ = 0x3f7ffffa;
  auVar95._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar96,auVar95);
  auVar96 = vpmaxsd_avx2(auVar101,auVar108);
  auVar95 = vpmaxsd_avx2(auVar102,auVar106);
  auVar96 = vminps_avx(auVar96,auVar95);
  auVar95 = vpmaxsd_avx2(auVar103,auVar92);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar98._4_4_ = uVar147;
  auVar98._0_4_ = uVar147;
  auVar98._8_4_ = uVar147;
  auVar98._12_4_ = uVar147;
  auVar98._16_4_ = uVar147;
  auVar98._20_4_ = uVar147;
  auVar98._24_4_ = uVar147;
  auVar98._28_4_ = uVar147;
  auVar95 = vminps_avx512vl(auVar95,auVar98);
  auVar96 = vminps_avx(auVar96,auVar95);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar99);
  auVar95 = vpbroadcastd_avx512vl();
  uVar13 = vpcmpgtd_avx512vl(auVar95,_DAT_0205a920);
  uVar12 = vcmpps_avx512vl(local_420,auVar96,2);
  bVar78 = (byte)((byte)uVar12 & (byte)uVar13) == 0;
  bVar79 = !bVar78;
  if (bVar78) {
    return bVar79;
  }
  local_858 = (ulong)(byte)((byte)uVar12 & (byte)uVar13);
  local_690 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_860 = prim;
LAB_01e0ad2c:
  lVar77 = 0;
  for (uVar72 = local_858; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    lVar77 = lVar77 + 1;
  }
  local_8c8 = (ulong)*(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[local_8c8].ptr;
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar77 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar77 = *(long *)&pGVar3[1].time_range.upper;
  auVar83 = *(undefined1 (*) [16])(lVar77 + (long)p_Var4 * uVar72);
  auVar84 = *(undefined1 (*) [16])(lVar77 + (uVar72 + 1) * (long)p_Var4);
  auVar85 = *(undefined1 (*) [16])(lVar77 + (uVar72 + 2) * (long)p_Var4);
  local_858 = local_858 - 1 & local_858;
  auVar1 = *(undefined1 (*) [16])(lVar77 + (uVar72 + 3) * (long)p_Var4);
  if (local_858 != 0) {
    uVar74 = local_858 - 1 & local_858;
    for (uVar72 = local_858; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    }
    if (uVar74 != 0) {
      for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar220 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar252._4_4_ = uVar147;
  auVar252._0_4_ = uVar147;
  auVar252._8_4_ = uVar147;
  auVar252._12_4_ = uVar147;
  local_4a0._16_4_ = uVar147;
  local_4a0._0_16_ = auVar252;
  local_4a0._20_4_ = uVar147;
  local_4a0._24_4_ = uVar147;
  local_4a0._28_4_ = uVar147;
  auVar255 = ZEXT3264(local_4a0);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar256._4_4_ = uVar147;
  auVar256._0_4_ = uVar147;
  auVar256._8_4_ = uVar147;
  auVar256._12_4_ = uVar147;
  local_4c0._16_4_ = uVar147;
  local_4c0._0_16_ = auVar256;
  local_4c0._20_4_ = uVar147;
  local_4c0._24_4_ = uVar147;
  local_4c0._28_4_ = uVar147;
  auVar257 = ZEXT3264(local_4c0);
  auVar81 = vunpcklps_avx(auVar252,auVar256);
  fVar241 = *(float *)(ray + k * 4 + 0x60);
  auVar258._4_4_ = fVar241;
  auVar258._0_4_ = fVar241;
  auVar258._8_4_ = fVar241;
  auVar258._12_4_ = fVar241;
  local_4e0._16_4_ = fVar241;
  local_4e0._0_16_ = auVar258;
  local_4e0._20_4_ = fVar241;
  local_4e0._24_4_ = fVar241;
  local_4e0._28_4_ = fVar241;
  local_7d0 = vinsertps_avx(auVar81,auVar258,0x28);
  auVar242 = ZEXT1664(local_7d0);
  auVar89._0_4_ = auVar83._0_4_ + auVar84._0_4_ + auVar85._0_4_ + auVar1._0_4_;
  auVar89._4_4_ = auVar83._4_4_ + auVar84._4_4_ + auVar85._4_4_ + auVar1._4_4_;
  auVar89._8_4_ = auVar83._8_4_ + auVar84._8_4_ + auVar85._8_4_ + auVar1._8_4_;
  auVar89._12_4_ = auVar83._12_4_ + auVar84._12_4_ + auVar85._12_4_ + auVar1._12_4_;
  auVar88._8_4_ = 0x3e800000;
  auVar88._0_8_ = 0x3e8000003e800000;
  auVar88._12_4_ = 0x3e800000;
  auVar81 = vmulps_avx512vl(auVar89,auVar88);
  auVar81 = vsubps_avx(auVar81,auVar220);
  auVar81 = vdpps_avx(auVar81,local_7d0,0x7f);
  fVar146 = *(float *)(ray + k * 4 + 0x30);
  auVar248 = ZEXT464((uint)fVar146);
  local_7e0 = vdpps_avx(local_7d0,local_7d0,0x7f);
  auVar250 = ZEXT1664(local_7e0);
  auVar234._4_12_ = ZEXT812(0) << 0x20;
  auVar234._0_4_ = local_7e0._0_4_;
  auVar82 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar234);
  auVar86 = vfnmadd213ss_fma(auVar82,local_7e0,ZEXT416(0x40000000));
  local_220 = auVar81._0_4_ * auVar82._0_4_ * auVar86._0_4_;
  auVar232 = ZEXT464((uint)local_220);
  auVar235._4_4_ = local_220;
  auVar235._0_4_ = local_220;
  auVar235._8_4_ = local_220;
  auVar235._12_4_ = local_220;
  fStack_5b0 = local_220;
  _local_5c0 = auVar235;
  fStack_5ac = local_220;
  fStack_5a8 = local_220;
  fStack_5a4 = local_220;
  auVar81 = vfmadd231ps_fma(auVar220,local_7d0,auVar235);
  auVar81 = vblendps_avx(auVar81,ZEXT816(0) << 0x40,8);
  auVar83 = vsubps_avx(auVar83,auVar81);
  auVar85 = vsubps_avx(auVar85,auVar81);
  auVar84 = vsubps_avx(auVar84,auVar81);
  auVar240 = ZEXT1664(auVar84);
  auVar1 = vsubps_avx(auVar1,auVar81);
  local_240 = vbroadcastss_avx512vl(auVar83);
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  local_760 = ZEXT1632(auVar83);
  local_260 = vpermps_avx512vl(auVar115,local_760);
  auVar116._8_4_ = 2;
  auVar116._0_8_ = 0x200000002;
  auVar116._12_4_ = 2;
  auVar116._16_4_ = 2;
  auVar116._20_4_ = 2;
  auVar116._24_4_ = 2;
  auVar116._28_4_ = 2;
  local_280 = vpermps_avx512vl(auVar116,local_760);
  auVar117._8_4_ = 3;
  auVar117._0_8_ = 0x300000003;
  auVar117._12_4_ = 3;
  auVar117._16_4_ = 3;
  auVar117._20_4_ = 3;
  auVar117._24_4_ = 3;
  auVar117._28_4_ = 3;
  local_2a0 = vpermps_avx512vl(auVar117,local_760);
  local_2c0 = vbroadcastss_avx512vl(auVar84);
  local_7a0 = ZEXT1632(auVar84);
  local_2e0 = vpermps_avx512vl(auVar115,local_7a0);
  local_300 = vpermps_avx512vl(auVar116,local_7a0);
  local_320 = vpermps_avx512vl(auVar117,local_7a0);
  local_340 = vbroadcastss_avx512vl(auVar85);
  local_780 = ZEXT1632(auVar85);
  local_360 = vpermps_avx512vl(auVar115,local_780);
  local_380 = vpermps_avx512vl(auVar116,local_780);
  local_3a0 = vpermps_avx512vl(auVar117,local_780);
  local_3c0 = vbroadcastss_avx512vl(auVar1);
  _local_7c0 = ZEXT1632(auVar1);
  _local_1e0 = vpermps_avx2(auVar115,_local_7c0);
  local_500 = vpermps_avx512vl(auVar116,_local_7c0);
  local_400 = vpermps_avx2(auVar117,_local_7c0);
  auVar83 = vfmadd231ps_fma(ZEXT432((uint)(fVar241 * fVar241)),local_4c0,local_4c0);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),local_4a0,local_4a0);
  uVar147 = auVar83._0_4_;
  local_200._4_4_ = uVar147;
  local_200._0_4_ = uVar147;
  local_200._8_4_ = uVar147;
  local_200._12_4_ = uVar147;
  local_200._16_4_ = uVar147;
  local_200._20_4_ = uVar147;
  local_200._24_4_ = uVar147;
  local_200._28_4_ = uVar147;
  vandps_avx512vl(local_200,auVar259._0_32_);
  local_730 = ZEXT416((uint)local_220);
  local_220 = fVar146 - local_220;
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  local_670 = vpbroadcastd_avx512vl();
  local_8c0 = 1;
  uVar72 = 0;
  bVar75 = 0;
  local_680 = vpbroadcastd_avx512vl();
  auVar83 = vsqrtss_avx(local_7e0,local_7e0);
  local_8a4 = auVar83._0_4_;
  auVar83 = vsqrtss_avx(local_7e0,local_7e0);
  local_8a8 = auVar83._0_4_;
  auVar206 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_3e0 = local_500;
  do {
    local_870 = auVar206._0_16_;
    auVar83 = vmovshdup_avx(local_870);
    fVar241 = auVar206._0_4_;
    fVar191 = auVar83._0_4_ - fVar241;
    fVar238 = fVar191 * 0.04761905;
    auVar225._4_4_ = fVar241;
    auVar225._0_4_ = fVar241;
    auVar225._8_4_ = fVar241;
    auVar225._12_4_ = fVar241;
    auVar225._16_4_ = fVar241;
    auVar225._20_4_ = fVar241;
    auVar225._24_4_ = fVar241;
    auVar225._28_4_ = fVar241;
    local_800._4_4_ = fVar191;
    local_800._0_4_ = fVar191;
    local_800._8_4_ = fVar191;
    local_800._12_4_ = fVar191;
    local_800._16_4_ = fVar191;
    local_800._20_4_ = fVar191;
    local_800._24_4_ = fVar191;
    local_800._28_4_ = fVar191;
    auVar83 = vfmadd231ps_fma(auVar225,local_800,_DAT_02020f20);
    auVar96 = vsubps_avx(auVar219._0_32_,ZEXT1632(auVar83));
    fVar241 = auVar96._0_4_;
    fVar244 = auVar96._4_4_;
    fVar236 = auVar96._8_4_;
    fVar246 = auVar96._12_4_;
    fVar230 = auVar96._16_4_;
    fVar231 = auVar96._20_4_;
    fVar247 = auVar96._24_4_;
    fVar148 = fVar241 * fVar241 * fVar241;
    fVar166 = fVar244 * fVar244 * fVar244;
    auVar29._4_4_ = fVar166;
    auVar29._0_4_ = fVar148;
    fVar167 = fVar236 * fVar236 * fVar236;
    auVar29._8_4_ = fVar167;
    fVar168 = fVar246 * fVar246 * fVar246;
    auVar29._12_4_ = fVar168;
    fVar169 = fVar230 * fVar230 * fVar230;
    auVar29._16_4_ = fVar169;
    fVar170 = fVar231 * fVar231 * fVar231;
    auVar29._20_4_ = fVar170;
    fVar171 = fVar247 * fVar247 * fVar247;
    auVar29._24_4_ = fVar171;
    auVar29._28_4_ = fVar191;
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar97 = vmulps_avx512vl(auVar29,auVar95);
    fVar243 = auVar83._0_4_;
    fVar245 = auVar83._4_4_;
    fVar237 = auVar83._8_4_;
    fVar210 = auVar83._12_4_;
    fVar190 = fVar243 * fVar243 * fVar243;
    fVar207 = fVar245 * fVar245 * fVar245;
    fVar208 = fVar237 * fVar237 * fVar237;
    fVar209 = fVar210 * fVar210 * fVar210;
    auVar259._28_36_ = auVar206._28_36_;
    auVar259._0_28_ = ZEXT1628(CONCAT412(fVar209,CONCAT48(fVar208,CONCAT44(fVar207,fVar190))));
    auVar219._0_4_ = fVar243 * fVar241;
    auVar219._4_4_ = fVar245 * fVar244;
    auVar219._8_4_ = fVar237 * fVar236;
    auVar219._12_4_ = fVar210 * fVar246;
    auVar219._16_4_ = fVar230 * 0.0;
    auVar219._20_4_ = fVar231 * 0.0;
    auVar219._28_36_ = auVar248._28_36_;
    auVar219._24_4_ = fVar247 * 0.0;
    auVar98 = vmulps_avx512vl(auVar259._0_32_,auVar95);
    fVar251 = auVar98._28_4_ + fVar191;
    fVar30 = auVar255._28_4_;
    fVar233 = fVar251 + fVar30 + auVar232._28_4_;
    auVar31._4_4_ = fVar166 * 0.16666667;
    auVar31._0_4_ = fVar148 * 0.16666667;
    auVar31._8_4_ = fVar167 * 0.16666667;
    auVar31._12_4_ = fVar168 * 0.16666667;
    auVar31._16_4_ = fVar169 * 0.16666667;
    auVar31._20_4_ = fVar170 * 0.16666667;
    auVar31._24_4_ = fVar171 * 0.16666667;
    auVar31._28_4_ = fVar251;
    auVar32._4_4_ =
         (auVar219._4_4_ * fVar244 * 12.0 + auVar219._4_4_ * fVar245 * 6.0 + fVar207 + auVar97._4_4_
         ) * 0.16666667;
    auVar32._0_4_ =
         (auVar219._0_4_ * fVar241 * 12.0 + auVar219._0_4_ * fVar243 * 6.0 + fVar190 + auVar97._0_4_
         ) * 0.16666667;
    auVar32._8_4_ =
         (auVar219._8_4_ * fVar236 * 12.0 + auVar219._8_4_ * fVar237 * 6.0 + fVar208 + auVar97._8_4_
         ) * 0.16666667;
    auVar32._12_4_ =
         (auVar219._12_4_ * fVar246 * 12.0 + auVar219._12_4_ * fVar210 * 6.0 +
         fVar209 + auVar97._12_4_) * 0.16666667;
    auVar32._16_4_ =
         (auVar219._16_4_ * fVar230 * 12.0 + auVar219._16_4_ * 0.0 * 6.0 + auVar97._16_4_ + 0.0) *
         0.16666667;
    auVar32._20_4_ =
         (auVar219._20_4_ * fVar231 * 12.0 + auVar219._20_4_ * 0.0 * 6.0 + auVar97._20_4_ + 0.0) *
         0.16666667;
    auVar32._24_4_ =
         (auVar219._24_4_ * fVar247 * 12.0 + auVar219._24_4_ * 0.0 * 6.0 + auVar97._24_4_ + 0.0) *
         0.16666667;
    auVar32._28_4_ = fVar30;
    auVar33._4_4_ =
         (auVar98._4_4_ + fVar166 + auVar219._4_4_ * fVar245 * 12.0 + auVar219._4_4_ * fVar244 * 6.0
         ) * 0.16666667;
    auVar33._0_4_ =
         (auVar98._0_4_ + fVar148 + auVar219._0_4_ * fVar243 * 12.0 + auVar219._0_4_ * fVar241 * 6.0
         ) * 0.16666667;
    auVar33._8_4_ =
         (auVar98._8_4_ + fVar167 + auVar219._8_4_ * fVar237 * 12.0 + auVar219._8_4_ * fVar236 * 6.0
         ) * 0.16666667;
    auVar33._12_4_ =
         (auVar98._12_4_ + fVar168 +
         auVar219._12_4_ * fVar210 * 12.0 + auVar219._12_4_ * fVar246 * 6.0) * 0.16666667;
    auVar33._16_4_ =
         (auVar98._16_4_ + fVar169 + auVar219._16_4_ * 0.0 * 12.0 + auVar219._16_4_ * fVar230 * 6.0)
         * 0.16666667;
    auVar33._20_4_ =
         (auVar98._20_4_ + fVar170 + auVar219._20_4_ * 0.0 * 12.0 + auVar219._20_4_ * fVar231 * 6.0)
         * 0.16666667;
    auVar33._24_4_ =
         (auVar98._24_4_ + fVar171 + auVar219._24_4_ * 0.0 * 12.0 + auVar219._24_4_ * fVar247 * 6.0)
         * 0.16666667;
    auVar33._28_4_ = auVar257._28_4_;
    fVar190 = fVar190 * 0.16666667;
    fVar207 = fVar207 * 0.16666667;
    fVar208 = fVar208 * 0.16666667;
    fVar209 = fVar209 * 0.16666667;
    auVar34._28_4_ = fVar233;
    auVar34._0_28_ = ZEXT1628(CONCAT412(fVar209,CONCAT48(fVar208,CONCAT44(fVar207,fVar190))));
    auVar98 = vmulps_avx512vl(local_3c0,auVar34);
    auVar35._4_4_ = (float)local_1e0._4_4_ * fVar207;
    auVar35._0_4_ = (float)local_1e0._0_4_ * fVar190;
    auVar35._8_4_ = fStack_1d8 * fVar208;
    auVar35._12_4_ = fStack_1d4 * fVar209;
    auVar35._16_4_ = fStack_1d0 * 0.0;
    auVar35._20_4_ = fStack_1cc * 0.0;
    auVar35._24_4_ = fStack_1c8 * 0.0;
    auVar35._28_4_ = auVar250._28_4_ + auVar257._28_4_ + auVar206._28_4_ + auVar97._28_4_;
    auVar97 = vmulps_avx512vl(local_3e0,auVar34);
    auVar36._4_4_ = local_400._4_4_ * fVar207;
    auVar36._0_4_ = local_400._0_4_ * fVar190;
    auVar36._8_4_ = local_400._8_4_ * fVar208;
    auVar36._12_4_ = local_400._12_4_ * fVar209;
    auVar36._16_4_ = local_400._16_4_ * 0.0;
    auVar36._20_4_ = local_400._20_4_ * 0.0;
    auVar36._24_4_ = local_400._24_4_ * 0.0;
    auVar36._28_4_ = fVar233;
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar33,local_340);
    auVar99 = vfmadd231ps_avx512vl(auVar35,auVar33,local_360);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar33,local_380);
    auVar100 = vfmadd231ps_avx512vl(auVar36,local_3a0,auVar33);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar32,local_2c0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar32,local_2e0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar32,local_300);
    auVar100 = vfmadd231ps_avx512vl(auVar100,local_320,auVar32);
    auVar101 = vfmadd231ps_avx512vl(auVar98,auVar31,local_240);
    auVar102 = vfmadd231ps_avx512vl(auVar99,auVar31,local_260);
    auVar103 = vfmadd231ps_avx512vl(auVar97,auVar31,local_280);
    auVar97 = vfmadd231ps_avx512vl(auVar100,local_2a0,auVar31);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar99 = vxorps_avx512vl(auVar96,auVar98);
    auVar98 = vxorps_avx512vl(ZEXT1632(auVar83),auVar98);
    auVar226._0_4_ = auVar98._0_4_ * fVar243;
    auVar226._4_4_ = auVar98._4_4_ * fVar245;
    auVar226._8_4_ = auVar98._8_4_ * fVar237;
    auVar226._12_4_ = auVar98._12_4_ * fVar210;
    auVar226._16_4_ = auVar98._16_4_ * 0.0;
    auVar226._20_4_ = auVar98._20_4_ * 0.0;
    auVar226._24_4_ = auVar98._24_4_ * 0.0;
    auVar226._28_4_ = 0;
    auVar100 = vmulps_avx512vl(auVar219._0_32_,auVar95);
    auVar95 = vsubps_avx(auVar226,auVar100);
    auVar37._4_4_ = auVar99._4_4_ * fVar244 * 0.5;
    auVar37._0_4_ = auVar99._0_4_ * fVar241 * 0.5;
    auVar37._8_4_ = auVar99._8_4_ * fVar236 * 0.5;
    auVar37._12_4_ = auVar99._12_4_ * fVar246 * 0.5;
    auVar37._16_4_ = auVar99._16_4_ * fVar230 * 0.5;
    auVar37._20_4_ = auVar99._20_4_ * fVar231 * 0.5;
    auVar37._24_4_ = auVar99._24_4_ * fVar247 * 0.5;
    auVar37._28_4_ = auVar96._28_4_;
    auVar38._4_4_ = auVar95._4_4_ * 0.5;
    auVar38._0_4_ = auVar95._0_4_ * 0.5;
    auVar38._8_4_ = auVar95._8_4_ * 0.5;
    auVar38._12_4_ = auVar95._12_4_ * 0.5;
    auVar38._16_4_ = auVar95._16_4_ * 0.5;
    auVar38._20_4_ = auVar95._20_4_ * 0.5;
    auVar38._24_4_ = auVar95._24_4_ * 0.5;
    auVar38._28_4_ = auVar95._28_4_;
    auVar39._4_4_ = (fVar244 * fVar244 + auVar100._4_4_) * 0.5;
    auVar39._0_4_ = (fVar241 * fVar241 + auVar100._0_4_) * 0.5;
    auVar39._8_4_ = (fVar236 * fVar236 + auVar100._8_4_) * 0.5;
    auVar39._12_4_ = (fVar246 * fVar246 + auVar100._12_4_) * 0.5;
    auVar39._16_4_ = (fVar230 * fVar230 + auVar100._16_4_) * 0.5;
    auVar39._20_4_ = (fVar231 * fVar231 + auVar100._20_4_) * 0.5;
    auVar39._24_4_ = (fVar247 * fVar247 + auVar100._24_4_) * 0.5;
    auVar39._28_4_ = auVar240._28_4_ + auVar100._28_4_;
    fVar241 = fVar243 * fVar243 * 0.5;
    fVar243 = fVar245 * fVar245 * 0.5;
    fVar244 = fVar237 * fVar237 * 0.5;
    fVar245 = fVar210 * fVar210 * 0.5;
    auVar40._28_4_ = auVar242._28_4_;
    auVar40._0_28_ = ZEXT1628(CONCAT412(fVar245,CONCAT48(fVar244,CONCAT44(fVar243,fVar241))));
    auVar96 = vmulps_avx512vl(local_3c0,auVar40);
    auVar41._4_4_ = fVar243 * (float)local_1e0._4_4_;
    auVar41._0_4_ = fVar241 * (float)local_1e0._0_4_;
    auVar41._8_4_ = fVar244 * fStack_1d8;
    auVar41._12_4_ = fVar245 * fStack_1d4;
    auVar41._16_4_ = fStack_1d0 * 0.0;
    auVar41._20_4_ = fStack_1cc * 0.0;
    auVar41._24_4_ = fStack_1c8 * 0.0;
    auVar41._28_4_ = fVar30;
    auVar95 = vmulps_avx512vl(local_3e0,auVar40);
    auVar42._4_4_ = fVar243 * local_400._4_4_;
    auVar42._0_4_ = fVar241 * local_400._0_4_;
    auVar42._8_4_ = fVar244 * local_400._8_4_;
    auVar42._12_4_ = fVar245 * local_400._12_4_;
    auVar42._16_4_ = local_400._16_4_ * 0.0;
    auVar42._20_4_ = local_400._20_4_ * 0.0;
    auVar42._24_4_ = local_400._24_4_ * 0.0;
    auVar42._28_4_ = auVar242._28_4_;
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar39,local_340);
    auVar99 = vfmadd231ps_avx512vl(auVar41,auVar39,local_360);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar39,local_380);
    auVar100 = vfmadd231ps_avx512vl(auVar42,local_3a0,auVar39);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar38,local_2c0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar38,local_2e0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar38,local_300);
    auVar100 = vfmadd231ps_avx512vl(auVar100,local_320,auVar38);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar37,local_240);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar37,local_260);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar37,local_280);
    auVar100 = vfmadd231ps_avx512vl(auVar100,local_2a0,auVar37);
    auVar43._4_4_ = auVar96._4_4_ * fVar238;
    auVar43._0_4_ = auVar96._0_4_ * fVar238;
    auVar43._8_4_ = auVar96._8_4_ * fVar238;
    auVar43._12_4_ = auVar96._12_4_ * fVar238;
    auVar43._16_4_ = auVar96._16_4_ * fVar238;
    auVar43._20_4_ = auVar96._20_4_ * fVar238;
    auVar43._24_4_ = auVar96._24_4_ * fVar238;
    auVar43._28_4_ = auVar98._28_4_;
    auVar250 = ZEXT3264(auVar43);
    auVar44._4_4_ = auVar99._4_4_ * fVar238;
    auVar44._0_4_ = auVar99._0_4_ * fVar238;
    auVar44._8_4_ = auVar99._8_4_ * fVar238;
    auVar44._12_4_ = auVar99._12_4_ * fVar238;
    auVar44._16_4_ = auVar99._16_4_ * fVar238;
    auVar44._20_4_ = auVar99._20_4_ * fVar238;
    auVar44._24_4_ = auVar99._24_4_ * fVar238;
    auVar44._28_4_ = auVar99._28_4_;
    auVar255 = ZEXT3264(auVar44);
    auVar45._4_4_ = auVar95._4_4_ * fVar238;
    auVar45._0_4_ = auVar95._0_4_ * fVar238;
    auVar45._8_4_ = auVar95._8_4_ * fVar238;
    auVar45._12_4_ = auVar95._12_4_ * fVar238;
    auVar45._16_4_ = auVar95._16_4_ * fVar238;
    auVar45._20_4_ = auVar95._20_4_ * fVar238;
    auVar45._24_4_ = auVar95._24_4_ * fVar238;
    auVar45._28_4_ = auVar95._28_4_;
    auVar257 = ZEXT3264(auVar45);
    fVar241 = auVar100._0_4_ * fVar238;
    fVar243 = auVar100._4_4_ * fVar238;
    auVar46._4_4_ = fVar243;
    auVar46._0_4_ = fVar241;
    fVar244 = auVar100._8_4_ * fVar238;
    auVar46._8_4_ = fVar244;
    fVar245 = auVar100._12_4_ * fVar238;
    auVar46._12_4_ = fVar245;
    fVar236 = auVar100._16_4_ * fVar238;
    auVar46._16_4_ = fVar236;
    fVar237 = auVar100._20_4_ * fVar238;
    auVar46._20_4_ = fVar237;
    fVar238 = auVar100._24_4_ * fVar238;
    auVar46._24_4_ = fVar238;
    auVar46._28_4_ = local_400._28_4_;
    auVar83 = vxorps_avx512vl(local_3a0._0_16_,local_3a0._0_16_);
    auVar100 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,ZEXT1632(auVar83));
    auVar240 = ZEXT3264(auVar100);
    auVar104 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,ZEXT1632(auVar83));
    auVar242 = ZEXT3264(auVar104);
    auVar98 = ZEXT1632(auVar83);
    auVar93 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,auVar98);
    auVar248 = ZEXT3264(auVar93);
    auVar227._0_4_ = fVar241 + auVar97._0_4_;
    auVar227._4_4_ = fVar243 + auVar97._4_4_;
    auVar227._8_4_ = fVar244 + auVar97._8_4_;
    auVar227._12_4_ = fVar245 + auVar97._12_4_;
    auVar227._16_4_ = fVar236 + auVar97._16_4_;
    auVar227._20_4_ = fVar237 + auVar97._20_4_;
    auVar227._24_4_ = fVar238 + auVar97._24_4_;
    auVar227._28_4_ = local_400._28_4_ + auVar97._28_4_;
    auVar96 = vmaxps_avx(auVar97,auVar227);
    auVar95 = vminps_avx(auVar97,auVar227);
    auVar94 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,auVar98);
    auVar105 = vpermt2ps_avx512vl(auVar43,_DAT_0205fd20,auVar98);
    auVar91 = vpermt2ps_avx512vl(auVar44,_DAT_0205fd20,auVar98);
    auVar117 = ZEXT1632(auVar83);
    auVar92 = vpermt2ps_avx512vl(auVar45,_DAT_0205fd20,auVar117);
    auVar97 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar117);
    auVar106 = vsubps_avx512vl(auVar94,auVar97);
    auVar97 = vsubps_avx(auVar100,auVar101);
    auVar98 = vsubps_avx(auVar104,auVar102);
    auVar99 = vsubps_avx(auVar93,auVar103);
    auVar232 = ZEXT3264(auVar99);
    auVar107 = vmulps_avx512vl(auVar98,auVar45);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar44,auVar99);
    auVar108 = vmulps_avx512vl(auVar99,auVar43);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar45,auVar97);
    auVar109 = vmulps_avx512vl(auVar97,auVar44);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar43,auVar98);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar108 = vmulps_avx512vl(auVar99,auVar99);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar98,auVar98);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,auVar97);
    auVar109 = vrcp14ps_avx512vl(auVar108);
    auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar111 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar110);
    auVar109 = vfmadd132ps_avx512vl(auVar111,auVar109,auVar109);
    auVar107 = vmulps_avx512vl(auVar107,auVar109);
    auVar111 = vmulps_avx512vl(auVar98,auVar92);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar91,auVar99);
    auVar112 = vmulps_avx512vl(auVar99,auVar105);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar92,auVar97);
    auVar113 = vmulps_avx512vl(auVar97,auVar91);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar105,auVar98);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar109 = vmulps_avx512vl(auVar111,auVar109);
    auVar107 = vmaxps_avx512vl(auVar107,auVar109);
    auVar107 = vsqrtps_avx512vl(auVar107);
    auVar109 = vmaxps_avx512vl(auVar106,auVar94);
    auVar96 = vmaxps_avx512vl(auVar96,auVar109);
    auVar109 = vaddps_avx512vl(auVar107,auVar96);
    auVar96 = vminps_avx512vl(auVar106,auVar94);
    auVar96 = vminps_avx(auVar95,auVar96);
    auVar96 = vsubps_avx512vl(auVar96,auVar107);
    auVar118._8_4_ = 0x3f800002;
    auVar118._0_8_ = 0x3f8000023f800002;
    auVar118._12_4_ = 0x3f800002;
    auVar118._16_4_ = 0x3f800002;
    auVar118._20_4_ = 0x3f800002;
    auVar118._24_4_ = 0x3f800002;
    auVar118._28_4_ = 0x3f800002;
    auVar95 = vmulps_avx512vl(auVar109,auVar118);
    auVar121._8_4_ = 0x3f7ffffc;
    auVar121._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar121._12_4_ = 0x3f7ffffc;
    auVar121._16_4_ = 0x3f7ffffc;
    auVar121._20_4_ = 0x3f7ffffc;
    auVar121._24_4_ = 0x3f7ffffc;
    auVar121._28_4_ = 0x3f7ffffc;
    auVar94 = vmulps_avx512vl(auVar96,auVar121);
    auVar47._4_4_ = auVar95._4_4_ * auVar95._4_4_;
    auVar47._0_4_ = auVar95._0_4_ * auVar95._0_4_;
    auVar47._8_4_ = auVar95._8_4_ * auVar95._8_4_;
    auVar47._12_4_ = auVar95._12_4_ * auVar95._12_4_;
    auVar47._16_4_ = auVar95._16_4_ * auVar95._16_4_;
    auVar47._20_4_ = auVar95._20_4_ * auVar95._20_4_;
    auVar47._24_4_ = auVar95._24_4_ * auVar95._24_4_;
    auVar47._28_4_ = auVar94._28_4_;
    auVar96 = vrsqrt14ps_avx512vl(auVar108);
    auVar122._8_4_ = 0xbf000000;
    auVar122._0_8_ = 0xbf000000bf000000;
    auVar122._12_4_ = 0xbf000000;
    auVar122._16_4_ = 0xbf000000;
    auVar122._20_4_ = 0xbf000000;
    auVar122._24_4_ = 0xbf000000;
    auVar122._28_4_ = 0xbf000000;
    auVar95 = vmulps_avx512vl(auVar108,auVar122);
    auVar48._4_4_ = auVar96._4_4_ * auVar95._4_4_;
    auVar48._0_4_ = auVar96._0_4_ * auVar95._0_4_;
    auVar48._8_4_ = auVar96._8_4_ * auVar95._8_4_;
    auVar48._12_4_ = auVar96._12_4_ * auVar95._12_4_;
    auVar48._16_4_ = auVar96._16_4_ * auVar95._16_4_;
    auVar48._20_4_ = auVar96._20_4_ * auVar95._20_4_;
    auVar48._24_4_ = auVar96._24_4_ * auVar95._24_4_;
    auVar48._28_4_ = auVar95._28_4_;
    auVar95 = vmulps_avx512vl(auVar96,auVar96);
    auVar95 = vmulps_avx512vl(auVar95,auVar48);
    auVar123._8_4_ = 0x3fc00000;
    auVar123._0_8_ = 0x3fc000003fc00000;
    auVar123._12_4_ = 0x3fc00000;
    auVar123._16_4_ = 0x3fc00000;
    auVar123._20_4_ = 0x3fc00000;
    auVar123._24_4_ = 0x3fc00000;
    auVar123._28_4_ = 0x3fc00000;
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar96,auVar123);
    auVar49._4_4_ = auVar95._4_4_ * auVar97._4_4_;
    auVar49._0_4_ = auVar95._0_4_ * auVar97._0_4_;
    auVar49._8_4_ = auVar95._8_4_ * auVar97._8_4_;
    auVar49._12_4_ = auVar95._12_4_ * auVar97._12_4_;
    auVar49._16_4_ = auVar95._16_4_ * auVar97._16_4_;
    auVar49._20_4_ = auVar95._20_4_ * auVar97._20_4_;
    auVar49._24_4_ = auVar95._24_4_ * auVar97._24_4_;
    auVar49._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar98,auVar95);
    auVar106 = vmulps_avx512vl(auVar99,auVar95);
    auVar107 = vsubps_avx512vl(auVar117,auVar101);
    auVar108 = vsubps_avx512vl(auVar117,auVar102);
    auVar109 = vsubps_avx512vl(auVar117,auVar103);
    auVar111 = vmulps_avx512vl(local_4e0,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_4c0,auVar108);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_4a0,auVar107);
    auVar112 = vmulps_avx512vl(auVar109,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar108);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,auVar107);
    auVar113 = vmulps_avx512vl(local_4e0,auVar106);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar96,local_4c0);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar49,local_4a0);
    auVar106 = vmulps_avx512vl(auVar109,auVar106);
    auVar96 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar96);
    auVar106 = vfmadd231ps_avx512vl(auVar96,auVar107,auVar49);
    local_8a0 = vmulps_avx512vl(auVar113,auVar113);
    auVar114 = vsubps_avx512vl(local_200,local_8a0);
    auVar96 = vmulps_avx512vl(auVar113,auVar106);
    auVar96 = vsubps_avx512vl(auVar111,auVar96);
    auVar111 = vaddps_avx512vl(auVar96,auVar96);
    auVar96 = vmulps_avx512vl(auVar106,auVar106);
    local_820 = vsubps_avx512vl(auVar112,auVar96);
    auVar96 = vsubps_avx(local_820,auVar47);
    auVar112 = vmulps_avx512vl(auVar111,auVar111);
    auVar124._8_4_ = 0x40800000;
    auVar124._0_8_ = 0x4080000040800000;
    auVar124._12_4_ = 0x40800000;
    auVar124._16_4_ = 0x40800000;
    auVar124._20_4_ = 0x40800000;
    auVar124._24_4_ = 0x40800000;
    auVar124._28_4_ = 0x40800000;
    auVar115 = vmulps_avx512vl(auVar114,auVar124);
    auVar116 = vmulps_avx512vl(auVar115,auVar96);
    auVar116 = vsubps_avx512vl(auVar112,auVar116);
    uVar74 = vcmpps_avx512vl(auVar116,auVar117,5);
    bVar69 = (byte)uVar74;
    if (bVar69 == 0) {
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar116 = vsqrtps_avx512vl(auVar116);
      auVar117 = vaddps_avx512vl(auVar114,auVar114);
      auVar118 = vrcp14ps_avx512vl(auVar117);
      auVar117 = vfnmadd213ps_avx512vl(auVar117,auVar118,auVar110);
      auVar117 = vfmadd132ps_avx512vl(auVar117,auVar118,auVar118);
      auVar18._8_4_ = 0x80000000;
      auVar18._0_8_ = 0x8000000080000000;
      auVar18._12_4_ = 0x80000000;
      auVar18._16_4_ = 0x80000000;
      auVar18._20_4_ = 0x80000000;
      auVar18._24_4_ = 0x80000000;
      auVar18._28_4_ = 0x80000000;
      auVar118 = vxorps_avx512vl(auVar111,auVar18);
      auVar118 = vsubps_avx512vl(auVar118,auVar116);
      auVar118 = vmulps_avx512vl(auVar118,auVar117);
      auVar116 = vsubps_avx512vl(auVar116,auVar111);
      auVar116 = vmulps_avx512vl(auVar116,auVar117);
      auVar117 = vfmadd213ps_avx512vl(auVar113,auVar118,auVar106);
      local_540 = vmulps_avx512vl(auVar95,auVar117);
      auVar117 = vfmadd213ps_avx512vl(auVar113,auVar116,auVar106);
      local_560 = vmulps_avx512vl(auVar95,auVar117);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar117 = vblendmps_avx512vl(auVar117,auVar118);
      auVar119._0_4_ =
           (uint)(bVar69 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar69 & 1) * local_560._0_4_;
      bVar78 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar78 * auVar117._4_4_ | (uint)!bVar78 * local_560._4_4_;
      bVar78 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar78 * auVar117._8_4_ | (uint)!bVar78 * local_560._8_4_;
      bVar78 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar78 * auVar117._12_4_ | (uint)!bVar78 * local_560._12_4_;
      bVar78 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar78 * auVar117._16_4_ | (uint)!bVar78 * local_560._16_4_;
      bVar78 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar78 * auVar117._20_4_ | (uint)!bVar78 * local_560._20_4_;
      bVar78 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar78 * auVar117._24_4_ | (uint)!bVar78 * local_560._24_4_;
      bVar78 = SUB81(uVar74 >> 7,0);
      auVar119._28_4_ = (uint)bVar78 * auVar117._28_4_ | (uint)!bVar78 * local_560._28_4_;
      auVar215._8_4_ = 0xff800000;
      auVar215._0_8_ = 0xff800000ff800000;
      auVar215._12_4_ = 0xff800000;
      auVar215._16_4_ = 0xff800000;
      auVar215._20_4_ = 0xff800000;
      auVar215._24_4_ = 0xff800000;
      auVar215._28_4_ = 0xff800000;
      auVar117 = vblendmps_avx512vl(auVar215,auVar116);
      auVar120._0_4_ =
           (uint)(bVar69 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar116._0_4_;
      bVar78 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar78 * auVar117._4_4_ | (uint)!bVar78 * auVar116._4_4_;
      bVar78 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar78 * auVar117._8_4_ | (uint)!bVar78 * auVar116._8_4_;
      bVar78 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar78 * auVar117._12_4_ | (uint)!bVar78 * auVar116._12_4_;
      bVar78 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar78 * auVar117._16_4_ | (uint)!bVar78 * auVar116._16_4_;
      bVar78 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar78 * auVar117._20_4_ | (uint)!bVar78 * auVar116._20_4_;
      bVar78 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar78 * auVar117._24_4_ | (uint)!bVar78 * auVar116._24_4_;
      bVar78 = SUB81(uVar74 >> 7,0);
      auVar120._28_4_ = (uint)bVar78 * auVar117._28_4_ | (uint)!bVar78 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_8a0,auVar116);
      auVar117 = vmaxps_avx512vl(local_500,auVar116);
      auVar19._8_4_ = 0x36000000;
      auVar19._0_8_ = 0x3600000036000000;
      auVar19._12_4_ = 0x36000000;
      auVar19._16_4_ = 0x36000000;
      auVar19._20_4_ = 0x36000000;
      auVar19._24_4_ = 0x36000000;
      auVar19._28_4_ = 0x36000000;
      auVar117 = vmulps_avx512vl(auVar117,auVar19);
      vandps_avx512vl(auVar114,auVar116);
      uVar73 = vcmpps_avx512vl(auVar117,auVar117,1);
      uVar74 = uVar74 & uVar73;
      bVar76 = (byte)uVar74;
      if (bVar76 != 0) {
        uVar73 = vcmpps_avx512vl(auVar96,_DAT_02020f00,2);
        auVar229._8_4_ = 0xff800000;
        auVar229._0_8_ = 0xff800000ff800000;
        auVar229._12_4_ = 0xff800000;
        auVar229._16_4_ = 0xff800000;
        auVar229._20_4_ = 0xff800000;
        auVar229._24_4_ = 0xff800000;
        auVar229._28_4_ = 0xff800000;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar116 = vblendmps_avx512vl(auVar96,auVar229);
        bVar71 = (byte)uVar73;
        uVar80 = (uint)(bVar71 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar117._0_4_;
        bVar78 = (bool)((byte)(uVar73 >> 1) & 1);
        uVar139 = (uint)bVar78 * auVar116._4_4_ | (uint)!bVar78 * auVar117._4_4_;
        bVar78 = (bool)((byte)(uVar73 >> 2) & 1);
        uVar140 = (uint)bVar78 * auVar116._8_4_ | (uint)!bVar78 * auVar117._8_4_;
        bVar78 = (bool)((byte)(uVar73 >> 3) & 1);
        uVar141 = (uint)bVar78 * auVar116._12_4_ | (uint)!bVar78 * auVar117._12_4_;
        bVar78 = (bool)((byte)(uVar73 >> 4) & 1);
        uVar142 = (uint)bVar78 * auVar116._16_4_ | (uint)!bVar78 * auVar117._16_4_;
        bVar78 = (bool)((byte)(uVar73 >> 5) & 1);
        uVar143 = (uint)bVar78 * auVar116._20_4_ | (uint)!bVar78 * auVar117._20_4_;
        bVar78 = (bool)((byte)(uVar73 >> 6) & 1);
        uVar144 = (uint)bVar78 * auVar116._24_4_ | (uint)!bVar78 * auVar117._24_4_;
        bVar78 = SUB81(uVar73 >> 7,0);
        uVar145 = (uint)bVar78 * auVar116._28_4_ | (uint)!bVar78 * auVar117._28_4_;
        auVar119._0_4_ = (bVar76 & 1) * uVar80 | !(bool)(bVar76 & 1) * auVar119._0_4_;
        bVar78 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar119._4_4_ = bVar78 * uVar139 | !bVar78 * auVar119._4_4_;
        bVar78 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar119._8_4_ = bVar78 * uVar140 | !bVar78 * auVar119._8_4_;
        bVar78 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar119._12_4_ = bVar78 * uVar141 | !bVar78 * auVar119._12_4_;
        bVar78 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar119._16_4_ = bVar78 * uVar142 | !bVar78 * auVar119._16_4_;
        bVar78 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar119._20_4_ = bVar78 * uVar143 | !bVar78 * auVar119._20_4_;
        bVar78 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar119._24_4_ = bVar78 * uVar144 | !bVar78 * auVar119._24_4_;
        bVar78 = SUB81(uVar74 >> 7,0);
        auVar119._28_4_ = bVar78 * uVar145 | !bVar78 * auVar119._28_4_;
        auVar96 = vblendmps_avx512vl(auVar229,auVar96);
        bVar78 = (bool)((byte)(uVar73 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar73 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar73 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar73 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar73 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar73 >> 6) & 1);
        bVar11 = SUB81(uVar73 >> 7,0);
        auVar120._0_4_ =
             (uint)(bVar76 & 1) *
             ((uint)(bVar71 & 1) * auVar96._0_4_ | !(bool)(bVar71 & 1) * uVar80) |
             !(bool)(bVar76 & 1) * auVar120._0_4_;
        bVar5 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar120._4_4_ =
             (uint)bVar5 * ((uint)bVar78 * auVar96._4_4_ | !bVar78 * uVar139) |
             !bVar5 * auVar120._4_4_;
        bVar78 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar120._8_4_ =
             (uint)bVar78 * ((uint)bVar6 * auVar96._8_4_ | !bVar6 * uVar140) |
             !bVar78 * auVar120._8_4_;
        bVar78 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar120._12_4_ =
             (uint)bVar78 * ((uint)bVar7 * auVar96._12_4_ | !bVar7 * uVar141) |
             !bVar78 * auVar120._12_4_;
        bVar78 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar120._16_4_ =
             (uint)bVar78 * ((uint)bVar8 * auVar96._16_4_ | !bVar8 * uVar142) |
             !bVar78 * auVar120._16_4_;
        bVar78 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar120._20_4_ =
             (uint)bVar78 * ((uint)bVar9 * auVar96._20_4_ | !bVar9 * uVar143) |
             !bVar78 * auVar120._20_4_;
        bVar78 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar120._24_4_ =
             (uint)bVar78 * ((uint)bVar10 * auVar96._24_4_ | !bVar10 * uVar144) |
             !bVar78 * auVar120._24_4_;
        bVar78 = SUB81(uVar74 >> 7,0);
        auVar120._28_4_ =
             (uint)bVar78 * ((uint)bVar11 * auVar96._28_4_ | !bVar11 * uVar145) |
             !bVar78 * auVar120._28_4_;
        bVar69 = (~bVar76 | bVar71) & bVar69;
      }
      auVar110._8_4_ = 0x3f800000;
      auVar110._0_8_ = &DAT_3f8000003f800000;
      auVar110._12_4_ = 0x3f800000;
      auVar110._16_4_ = 0x3f800000;
      auVar110._20_4_ = 0x3f800000;
      auVar110._24_4_ = 0x3f800000;
      auVar110._28_4_ = 0x3f800000;
    }
    auVar219 = ZEXT3264(auVar110);
    if ((bVar69 & 0x7f) == 0) {
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar259 = ZEXT3264(auVar96);
      auVar206 = ZEXT1664(local_870);
    }
    else {
      fVar241 = *(float *)(ray + k * 4 + 0x80) - (float)local_730._0_4_;
      auVar216._4_4_ = fVar241;
      auVar216._0_4_ = fVar241;
      auVar216._8_4_ = fVar241;
      auVar216._12_4_ = fVar241;
      auVar216._16_4_ = fVar241;
      auVar216._20_4_ = fVar241;
      auVar216._24_4_ = fVar241;
      auVar216._28_4_ = fVar241;
      auVar116 = vminps_avx512vl(auVar216,auVar120);
      auVar68._4_4_ = fStack_21c;
      auVar68._0_4_ = local_220;
      auVar68._8_4_ = fStack_218;
      auVar68._12_4_ = fStack_214;
      auVar68._16_4_ = fStack_210;
      auVar68._20_4_ = fStack_20c;
      auVar68._24_4_ = fStack_208;
      auVar68._28_4_ = fStack_204;
      auVar96 = vmaxps_avx512vl(auVar68,auVar119);
      auVar109 = vmulps_avx512vl(auVar45,auVar109);
      auVar108 = vfmadd213ps_avx512vl(auVar108,auVar44,auVar109);
      auVar107 = vfmadd213ps_avx512vl(auVar107,auVar43,auVar108);
      auVar108 = vmulps_avx512vl(local_4e0,auVar45);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_4c0,auVar44);
      auVar108 = vfmadd231ps_avx512vl(auVar108,local_4a0,auVar43);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar259 = ZEXT3264(auVar109);
      vandps_avx512vl(auVar108,auVar109);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar109,auVar117,1);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar107 = vxorps_avx512vl(auVar107,auVar118);
      auVar121 = vrcp14ps_avx512vl(auVar108);
      auVar122 = vxorps_avx512vl(auVar108,auVar118);
      auVar123 = vfnmadd213ps_avx512vl(auVar121,auVar108,auVar110);
      auVar123 = vfmadd132ps_avx512vl(auVar123,auVar121,auVar121);
      auVar107 = vmulps_avx512vl(auVar123,auVar107);
      uVar13 = vcmpps_avx512vl(auVar108,auVar122,1);
      bVar76 = (byte)uVar12 | (byte)uVar13;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar124 = vblendmps_avx512vl(auVar107,auVar123);
      auVar125._0_4_ =
           (uint)(bVar76 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar121._0_4_;
      bVar78 = (bool)(bVar76 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar78 * auVar124._4_4_ | (uint)!bVar78 * auVar121._4_4_;
      bVar78 = (bool)(bVar76 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar78 * auVar124._8_4_ | (uint)!bVar78 * auVar121._8_4_;
      bVar78 = (bool)(bVar76 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar78 * auVar124._12_4_ | (uint)!bVar78 * auVar121._12_4_;
      bVar78 = (bool)(bVar76 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar78 * auVar124._16_4_ | (uint)!bVar78 * auVar121._16_4_;
      bVar78 = (bool)(bVar76 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar78 * auVar124._20_4_ | (uint)!bVar78 * auVar121._20_4_;
      bVar78 = (bool)(bVar76 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar78 * auVar124._24_4_ | (uint)!bVar78 * auVar121._24_4_;
      auVar125._28_4_ =
           (uint)(bVar76 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar121._28_4_;
      auVar96 = vmaxps_avx(auVar96,auVar125);
      uVar13 = vcmpps_avx512vl(auVar108,auVar122,6);
      bVar76 = (byte)uVar12 | (byte)uVar13;
      auVar257 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar126._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * auVar107._0_4_;
      bVar78 = (bool)(bVar76 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar107._4_4_;
      bVar78 = (bool)(bVar76 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar107._8_4_;
      bVar78 = (bool)(bVar76 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar107._12_4_;
      bVar78 = (bool)(bVar76 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar107._16_4_;
      bVar78 = (bool)(bVar76 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar107._20_4_;
      bVar78 = (bool)(bVar76 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * auVar107._24_4_;
      auVar126._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar107._28_4_;
      auVar107 = vminps_avx(auVar116,auVar126);
      auVar83 = vxorps_avx512vl(auVar122._0_16_,auVar122._0_16_);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar83),auVar100);
      auVar104 = vsubps_avx512vl(ZEXT1632(auVar83),auVar104);
      auVar108 = ZEXT1632(auVar83);
      auVar93 = vsubps_avx512vl(auVar108,auVar93);
      auVar50._4_4_ = auVar93._4_4_ * auVar92._4_4_;
      auVar50._0_4_ = auVar93._0_4_ * auVar92._0_4_;
      auVar50._8_4_ = auVar93._8_4_ * auVar92._8_4_;
      auVar50._12_4_ = auVar93._12_4_ * auVar92._12_4_;
      auVar50._16_4_ = auVar93._16_4_ * auVar92._16_4_;
      auVar50._20_4_ = auVar93._20_4_ * auVar92._20_4_;
      auVar50._24_4_ = auVar93._24_4_ * auVar92._24_4_;
      auVar50._28_4_ = auVar93._28_4_;
      auVar104 = vfnmsub231ps_avx512vl(auVar50,auVar91,auVar104);
      auVar100 = vfnmadd231ps_avx512vl(auVar104,auVar105,auVar100);
      auVar104 = vmulps_avx512vl(local_4e0,auVar92);
      auVar104 = vfnmsub231ps_avx512vl(auVar104,local_4c0,auVar91);
      auVar104 = vfnmadd231ps_avx512vl(auVar104,local_4a0,auVar105);
      vandps_avx512vl(auVar104,auVar109);
      uVar12 = vcmpps_avx512vl(auVar104,auVar117,1);
      auVar100 = vxorps_avx512vl(auVar100,auVar118);
      auVar93 = vrcp14ps_avx512vl(auVar104);
      auVar105 = vxorps_avx512vl(auVar104,auVar118);
      auVar250 = ZEXT3264(auVar105);
      auVar92 = vfnmadd213ps_avx512vl(auVar93,auVar104,auVar110);
      auVar83 = vfmadd132ps_fma(auVar92,auVar93,auVar93);
      auVar255 = ZEXT1664(auVar83);
      fVar241 = auVar83._0_4_ * auVar100._0_4_;
      fVar243 = auVar83._4_4_ * auVar100._4_4_;
      auVar51._4_4_ = fVar243;
      auVar51._0_4_ = fVar241;
      fVar244 = auVar83._8_4_ * auVar100._8_4_;
      auVar51._8_4_ = fVar244;
      fVar245 = auVar83._12_4_ * auVar100._12_4_;
      auVar51._12_4_ = fVar245;
      fVar236 = auVar100._16_4_ * 0.0;
      auVar51._16_4_ = fVar236;
      fVar237 = auVar100._20_4_ * 0.0;
      auVar51._20_4_ = fVar237;
      fVar246 = auVar100._24_4_ * 0.0;
      auVar51._24_4_ = fVar246;
      auVar51._28_4_ = auVar100._28_4_;
      uVar13 = vcmpps_avx512vl(auVar104,auVar105,1);
      bVar76 = (byte)uVar12 | (byte)uVar13;
      auVar92 = vblendmps_avx512vl(auVar51,auVar123);
      auVar127._0_4_ =
           (uint)(bVar76 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar93._0_4_;
      bVar78 = (bool)(bVar76 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar78 * auVar92._4_4_ | (uint)!bVar78 * auVar93._4_4_;
      bVar78 = (bool)(bVar76 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar78 * auVar92._8_4_ | (uint)!bVar78 * auVar93._8_4_;
      bVar78 = (bool)(bVar76 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar78 * auVar92._12_4_ | (uint)!bVar78 * auVar93._12_4_;
      bVar78 = (bool)(bVar76 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar78 * auVar92._16_4_ | (uint)!bVar78 * auVar93._16_4_;
      bVar78 = (bool)(bVar76 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar78 * auVar92._20_4_ | (uint)!bVar78 * auVar93._20_4_;
      bVar78 = (bool)(bVar76 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar78 * auVar92._24_4_ | (uint)!bVar78 * auVar93._24_4_;
      auVar127._28_4_ =
           (uint)(bVar76 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar93._28_4_;
      auVar248 = ZEXT3264(auVar127);
      _local_6c0 = vmaxps_avx(auVar96,auVar127);
      uVar13 = vcmpps_avx512vl(auVar104,auVar105,6);
      bVar76 = (byte)uVar12 | (byte)uVar13;
      auVar128._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * (int)fVar241;
      bVar78 = (bool)(bVar76 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar243;
      bVar78 = (bool)(bVar76 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar244;
      bVar78 = (bool)(bVar76 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar245;
      bVar78 = (bool)(bVar76 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar236;
      bVar78 = (bool)(bVar76 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar237;
      bVar78 = (bool)(bVar76 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar246;
      auVar128._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar100._28_4_;
      auVar242 = ZEXT3264(auVar128);
      local_460 = vminps_avx(auVar107,auVar128);
      auVar240 = ZEXT3264(local_460);
      uVar12 = vcmpps_avx512vl(_local_6c0,local_460,2);
      bVar69 = bVar69 & 0x7f & (byte)uVar12;
      if (bVar69 == 0) {
        auVar219 = ZEXT3264(auVar110);
        auVar206 = ZEXT1664(local_870);
      }
      else {
        auVar100 = vmaxps_avx512vl(auVar108,auVar94);
        auVar96 = vminps_avx512vl(local_540,auVar110);
        auVar57 = ZEXT412(0);
        auVar248 = ZEXT1264(auVar57) << 0x20;
        auVar96 = vmaxps_avx(auVar96,ZEXT1232(auVar57) << 0x20);
        auVar104 = vminps_avx512vl(local_560,auVar110);
        auVar255 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar52._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
        auVar52._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
        auVar52._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
        auVar52._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
        auVar52._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
        auVar52._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
        auVar52._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
        auVar52._28_4_ = auVar96._28_4_ + 7.0;
        auVar257 = ZEXT3264(local_800);
        auVar83 = vfmadd213ps_fma(auVar52,local_800,auVar225);
        local_540 = ZEXT1632(auVar83);
        auVar96 = vmaxps_avx(auVar104,ZEXT1232(auVar57) << 0x20);
        auVar53._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar96._28_4_ + 7.0;
        auVar83 = vfmadd213ps_fma(auVar53,local_800,auVar225);
        local_560 = ZEXT1632(auVar83);
        auVar217._0_4_ = auVar100._0_4_ * auVar100._0_4_;
        auVar217._4_4_ = auVar100._4_4_ * auVar100._4_4_;
        auVar217._8_4_ = auVar100._8_4_ * auVar100._8_4_;
        auVar217._12_4_ = auVar100._12_4_ * auVar100._12_4_;
        auVar217._16_4_ = auVar100._16_4_ * auVar100._16_4_;
        auVar217._20_4_ = auVar100._20_4_ * auVar100._20_4_;
        auVar217._24_4_ = auVar100._24_4_ * auVar100._24_4_;
        auVar217._28_4_ = 0;
        auVar96 = vsubps_avx(local_820,auVar217);
        auVar250 = ZEXT3264(auVar96);
        auVar100 = vmulps_avx512vl(auVar115,auVar96);
        auVar100 = vsubps_avx512vl(auVar112,auVar100);
        uVar12 = vcmpps_avx512vl(auVar100,ZEXT1232(auVar57) << 0x20,5);
        bVar76 = (byte)uVar12;
        if (bVar76 == 0) {
          auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar100 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar104 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar242 = ZEXT864(0) << 0x20;
          auVar129._8_4_ = 0x7f800000;
          auVar129._0_8_ = 0x7f8000007f800000;
          auVar129._12_4_ = 0x7f800000;
          auVar129._16_4_ = 0x7f800000;
          auVar129._20_4_ = 0x7f800000;
          auVar129._24_4_ = 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar130._8_4_ = 0xff800000;
          auVar130._0_8_ = 0xff800000ff800000;
          auVar130._12_4_ = 0xff800000;
          auVar130._16_4_ = 0xff800000;
          auVar130._20_4_ = 0xff800000;
          auVar130._24_4_ = 0xff800000;
          auVar130._28_4_ = 0xff800000;
        }
        else {
          auVar84 = vxorps_avx512vl(auVar91._0_16_,auVar91._0_16_);
          uVar74 = vcmpps_avx512vl(auVar100,auVar108,5);
          auVar100 = vsqrtps_avx(auVar100);
          auVar228._0_4_ = auVar114._0_4_ + auVar114._0_4_;
          auVar228._4_4_ = auVar114._4_4_ + auVar114._4_4_;
          auVar228._8_4_ = auVar114._8_4_ + auVar114._8_4_;
          auVar228._12_4_ = auVar114._12_4_ + auVar114._12_4_;
          auVar228._16_4_ = auVar114._16_4_ + auVar114._16_4_;
          auVar228._20_4_ = auVar114._20_4_ + auVar114._20_4_;
          auVar228._24_4_ = auVar114._24_4_ + auVar114._24_4_;
          auVar228._28_4_ = auVar114._28_4_ + auVar114._28_4_;
          auVar104 = vrcp14ps_avx512vl(auVar228);
          auVar93 = vfnmadd213ps_avx512vl(auVar228,auVar104,auVar110);
          auVar83 = vfmadd132ps_fma(auVar93,auVar104,auVar104);
          auVar20._8_4_ = 0x80000000;
          auVar20._0_8_ = 0x8000000080000000;
          auVar20._12_4_ = 0x80000000;
          auVar20._16_4_ = 0x80000000;
          auVar20._20_4_ = 0x80000000;
          auVar20._24_4_ = 0x80000000;
          auVar20._28_4_ = 0x80000000;
          auVar104 = vxorps_avx512vl(auVar111,auVar20);
          auVar104 = vsubps_avx(auVar104,auVar100);
          auVar54._4_4_ = auVar104._4_4_ * auVar83._4_4_;
          auVar54._0_4_ = auVar104._0_4_ * auVar83._0_4_;
          auVar54._8_4_ = auVar104._8_4_ * auVar83._8_4_;
          auVar54._12_4_ = auVar104._12_4_ * auVar83._12_4_;
          auVar54._16_4_ = auVar104._16_4_ * 0.0;
          auVar54._20_4_ = auVar104._20_4_ * 0.0;
          auVar54._24_4_ = auVar104._24_4_ * 0.0;
          auVar54._28_4_ = 0x3e000000;
          auVar255 = ZEXT3264(auVar54);
          auVar100 = vsubps_avx512vl(auVar100,auVar111);
          auVar55._4_4_ = auVar100._4_4_ * auVar83._4_4_;
          auVar55._0_4_ = auVar100._0_4_ * auVar83._0_4_;
          auVar55._8_4_ = auVar100._8_4_ * auVar83._8_4_;
          auVar55._12_4_ = auVar100._12_4_ * auVar83._12_4_;
          auVar55._16_4_ = auVar100._16_4_ * 0.0;
          auVar55._20_4_ = auVar100._20_4_ * 0.0;
          auVar55._24_4_ = auVar100._24_4_ * 0.0;
          auVar55._28_4_ = fVar191;
          auVar257 = ZEXT3264(auVar55);
          auVar100 = vfmadd213ps_avx512vl(auVar113,auVar54,auVar106);
          auVar56._4_4_ = auVar95._4_4_ * auVar100._4_4_;
          auVar56._0_4_ = auVar95._0_4_ * auVar100._0_4_;
          auVar56._8_4_ = auVar95._8_4_ * auVar100._8_4_;
          auVar56._12_4_ = auVar95._12_4_ * auVar100._12_4_;
          auVar56._16_4_ = auVar95._16_4_ * auVar100._16_4_;
          auVar56._20_4_ = auVar95._20_4_ * auVar100._20_4_;
          auVar56._24_4_ = auVar95._24_4_ * auVar100._24_4_;
          auVar56._28_4_ = auVar104._28_4_;
          auVar100 = vmulps_avx512vl(local_4a0,auVar54);
          auVar104 = vmulps_avx512vl(local_4c0,auVar54);
          auVar93 = vmulps_avx512vl(local_4e0,auVar54);
          auVar94 = vfmadd213ps_avx512vl(auVar97,auVar56,auVar101);
          auVar100 = vsubps_avx512vl(auVar100,auVar94);
          auVar94 = vfmadd213ps_avx512vl(auVar98,auVar56,auVar102);
          auVar104 = vsubps_avx512vl(auVar104,auVar94);
          auVar83 = vfmadd213ps_fma(auVar56,auVar99,auVar103);
          auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar83));
          auVar242 = ZEXT3264(auVar93);
          auVar93 = vfmadd213ps_avx512vl(auVar113,auVar55,auVar106);
          auVar93 = vmulps_avx512vl(auVar95,auVar93);
          auVar95 = vmulps_avx512vl(local_4a0,auVar55);
          auVar94 = vmulps_avx512vl(local_4c0,auVar55);
          auVar105 = vmulps_avx512vl(local_4e0,auVar55);
          auVar83 = vfmadd213ps_fma(auVar97,auVar93,auVar101);
          auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar83));
          auVar248 = ZEXT3264(auVar95);
          auVar83 = vfmadd213ps_fma(auVar98,auVar93,auVar102);
          auVar95 = vsubps_avx512vl(auVar94,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar99,auVar93,auVar103);
          auVar97 = vsubps_avx512vl(auVar105,ZEXT1632(auVar83));
          auVar157._8_4_ = 0x7f800000;
          auVar157._0_8_ = 0x7f8000007f800000;
          auVar157._12_4_ = 0x7f800000;
          auVar157._16_4_ = 0x7f800000;
          auVar157._20_4_ = 0x7f800000;
          auVar157._24_4_ = 0x7f800000;
          auVar157._28_4_ = 0x7f800000;
          auVar98 = vblendmps_avx512vl(auVar157,auVar54);
          bVar78 = (bool)((byte)uVar74 & 1);
          auVar129._0_4_ = (uint)bVar78 * auVar98._0_4_ | (uint)!bVar78 * auVar101._0_4_;
          bVar78 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar78 * auVar98._4_4_ | (uint)!bVar78 * auVar101._4_4_;
          bVar78 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar78 * auVar98._8_4_ | (uint)!bVar78 * auVar101._8_4_;
          bVar78 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar78 * auVar98._12_4_ | (uint)!bVar78 * auVar101._12_4_;
          bVar78 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar129._16_4_ = (uint)bVar78 * auVar98._16_4_ | (uint)!bVar78 * auVar101._16_4_;
          bVar78 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar129._20_4_ = (uint)bVar78 * auVar98._20_4_ | (uint)!bVar78 * auVar101._20_4_;
          bVar78 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar129._24_4_ = (uint)bVar78 * auVar98._24_4_ | (uint)!bVar78 * auVar101._24_4_;
          bVar78 = SUB81(uVar74 >> 7,0);
          auVar129._28_4_ = (uint)bVar78 * auVar98._28_4_ | (uint)!bVar78 * auVar101._28_4_;
          auVar158._8_4_ = 0xff800000;
          auVar158._0_8_ = 0xff800000ff800000;
          auVar158._12_4_ = 0xff800000;
          auVar158._16_4_ = 0xff800000;
          auVar158._20_4_ = 0xff800000;
          auVar158._24_4_ = 0xff800000;
          auVar158._28_4_ = 0xff800000;
          auVar98 = vblendmps_avx512vl(auVar158,auVar55);
          bVar78 = (bool)((byte)uVar74 & 1);
          auVar130._0_4_ = (uint)bVar78 * auVar98._0_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar78 * auVar98._4_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar78 * auVar98._8_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar78 * auVar98._12_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar78 * auVar98._16_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar78 * auVar98._20_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar78 * auVar98._24_4_ | (uint)!bVar78 * -0x800000;
          bVar78 = SUB81(uVar74 >> 7,0);
          auVar130._28_4_ = (uint)bVar78 * auVar98._28_4_ | (uint)!bVar78 * -0x800000;
          vandps_avx512vl(auVar109,local_8a0);
          auVar98 = vmaxps_avx(local_500,auVar130);
          auVar21._8_4_ = 0x36000000;
          auVar21._0_8_ = 0x3600000036000000;
          auVar21._12_4_ = 0x36000000;
          auVar21._16_4_ = 0x36000000;
          auVar21._20_4_ = 0x36000000;
          auVar21._24_4_ = 0x36000000;
          auVar21._28_4_ = 0x36000000;
          auVar98 = vmulps_avx512vl(auVar98,auVar21);
          vandps_avx512vl(auVar114,auVar109);
          uVar73 = vcmpps_avx512vl(auVar98,auVar98,1);
          uVar74 = uVar74 & uVar73;
          bVar71 = (byte)uVar74;
          if (bVar71 != 0) {
            uVar73 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar84),2);
            auVar239._8_4_ = 0xff800000;
            auVar239._0_8_ = 0xff800000ff800000;
            auVar239._12_4_ = 0xff800000;
            auVar239._16_4_ = 0xff800000;
            auVar239._20_4_ = 0xff800000;
            auVar239._24_4_ = 0xff800000;
            auVar239._28_4_ = 0xff800000;
            auVar249._8_4_ = 0x7f800000;
            auVar249._0_8_ = 0x7f8000007f800000;
            auVar249._12_4_ = 0x7f800000;
            auVar249._16_4_ = 0x7f800000;
            auVar249._20_4_ = 0x7f800000;
            auVar249._24_4_ = 0x7f800000;
            auVar249._28_4_ = 0x7f800000;
            auVar250 = ZEXT3264(auVar249);
            auVar96 = vblendmps_avx512vl(auVar249,auVar239);
            bVar70 = (byte)uVar73;
            uVar80 = (uint)(bVar70 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar98._0_4_;
            bVar78 = (bool)((byte)(uVar73 >> 1) & 1);
            uVar139 = (uint)bVar78 * auVar96._4_4_ | (uint)!bVar78 * auVar98._4_4_;
            bVar78 = (bool)((byte)(uVar73 >> 2) & 1);
            uVar140 = (uint)bVar78 * auVar96._8_4_ | (uint)!bVar78 * auVar98._8_4_;
            bVar78 = (bool)((byte)(uVar73 >> 3) & 1);
            uVar141 = (uint)bVar78 * auVar96._12_4_ | (uint)!bVar78 * auVar98._12_4_;
            bVar78 = (bool)((byte)(uVar73 >> 4) & 1);
            uVar142 = (uint)bVar78 * auVar96._16_4_ | (uint)!bVar78 * auVar98._16_4_;
            bVar78 = (bool)((byte)(uVar73 >> 5) & 1);
            uVar143 = (uint)bVar78 * auVar96._20_4_ | (uint)!bVar78 * auVar98._20_4_;
            bVar78 = (bool)((byte)(uVar73 >> 6) & 1);
            uVar144 = (uint)bVar78 * auVar96._24_4_ | (uint)!bVar78 * auVar98._24_4_;
            bVar78 = SUB81(uVar73 >> 7,0);
            uVar145 = (uint)bVar78 * auVar96._28_4_ | (uint)!bVar78 * auVar98._28_4_;
            auVar129._0_4_ = (bVar71 & 1) * uVar80 | !(bool)(bVar71 & 1) * auVar129._0_4_;
            bVar78 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar129._4_4_ = bVar78 * uVar139 | !bVar78 * auVar129._4_4_;
            bVar78 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar129._8_4_ = bVar78 * uVar140 | !bVar78 * auVar129._8_4_;
            bVar78 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar129._12_4_ = bVar78 * uVar141 | !bVar78 * auVar129._12_4_;
            bVar78 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar129._16_4_ = bVar78 * uVar142 | !bVar78 * auVar129._16_4_;
            bVar78 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar129._20_4_ = bVar78 * uVar143 | !bVar78 * auVar129._20_4_;
            bVar78 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar129._24_4_ = bVar78 * uVar144 | !bVar78 * auVar129._24_4_;
            bVar78 = SUB81(uVar74 >> 7,0);
            auVar129._28_4_ = bVar78 * uVar145 | !bVar78 * auVar129._28_4_;
            auVar96 = vblendmps_avx512vl(auVar239,auVar249);
            bVar78 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar73 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar73 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar73 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar73 >> 6) & 1);
            bVar11 = SUB81(uVar73 >> 7,0);
            auVar130._0_4_ =
                 (uint)(bVar71 & 1) *
                 ((uint)(bVar70 & 1) * auVar96._0_4_ | !(bool)(bVar70 & 1) * uVar80) |
                 !(bool)(bVar71 & 1) * auVar130._0_4_;
            bVar5 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar130._4_4_ =
                 (uint)bVar5 * ((uint)bVar78 * auVar96._4_4_ | !bVar78 * uVar139) |
                 !bVar5 * auVar130._4_4_;
            bVar78 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar130._8_4_ =
                 (uint)bVar78 * ((uint)bVar6 * auVar96._8_4_ | !bVar6 * uVar140) |
                 !bVar78 * auVar130._8_4_;
            bVar78 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar130._12_4_ =
                 (uint)bVar78 * ((uint)bVar7 * auVar96._12_4_ | !bVar7 * uVar141) |
                 !bVar78 * auVar130._12_4_;
            bVar78 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar130._16_4_ =
                 (uint)bVar78 * ((uint)bVar8 * auVar96._16_4_ | !bVar8 * uVar142) |
                 !bVar78 * auVar130._16_4_;
            bVar78 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar130._20_4_ =
                 (uint)bVar78 * ((uint)bVar9 * auVar96._20_4_ | !bVar9 * uVar143) |
                 !bVar78 * auVar130._20_4_;
            bVar78 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar130._24_4_ =
                 (uint)bVar78 * ((uint)bVar10 * auVar96._24_4_ | !bVar10 * uVar144) |
                 !bVar78 * auVar130._24_4_;
            bVar78 = SUB81(uVar74 >> 7,0);
            auVar130._28_4_ =
                 (uint)bVar78 * ((uint)bVar11 * auVar96._28_4_ | !bVar11 * uVar145) |
                 !bVar78 * auVar130._28_4_;
            bVar76 = (~bVar71 | bVar70) & bVar76;
          }
        }
        auVar96 = vmulps_avx512vl(local_4e0,auVar97);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_4c0,auVar95);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_4a0,auVar248._0_32_);
        _local_1c0 = _local_6c0;
        local_1a0 = vminps_avx(local_460,auVar129);
        vandps_avx512vl(auVar96,auVar109);
        _local_480 = vmaxps_avx(_local_6c0,auVar130);
        auVar232 = ZEXT3264(_local_480);
        auVar159._8_4_ = 0x3e99999a;
        auVar159._0_8_ = 0x3e99999a3e99999a;
        auVar159._12_4_ = 0x3e99999a;
        auVar159._16_4_ = 0x3e99999a;
        auVar159._20_4_ = 0x3e99999a;
        auVar159._24_4_ = 0x3e99999a;
        auVar159._28_4_ = 0x3e99999a;
        uVar12 = vcmpps_avx512vl(auVar96,auVar159,1);
        local_8ac = (undefined4)uVar12;
        uVar12 = vcmpps_avx512vl(_local_6c0,local_1a0,2);
        bVar71 = (byte)uVar12 & bVar69;
        _local_5a0 = _local_480;
        uVar13 = vcmpps_avx512vl(_local_480,local_460,2);
        if ((bVar69 & ((byte)uVar13 | (byte)uVar12)) == 0) {
          auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar206 = ZEXT1664(local_870);
        }
        else {
          auVar96 = vmulps_avx512vl(local_4e0,auVar242._0_32_);
          auVar96 = vfmadd213ps_avx512vl(auVar104,local_4c0,auVar96);
          auVar96 = vfmadd213ps_avx512vl(auVar100,local_4a0,auVar96);
          vandps_avx512vl(auVar96,auVar109);
          uVar12 = vcmpps_avx512vl(auVar96,auVar159,1);
          local_8b4 = (uint)(byte)~bVar76;
          bVar76 = (byte)uVar12 | ~bVar76;
          auVar160._8_4_ = 2;
          auVar160._0_8_ = 0x200000002;
          auVar160._12_4_ = 2;
          auVar160._16_4_ = 2;
          auVar160._20_4_ = 2;
          auVar160._24_4_ = 2;
          auVar160._28_4_ = 2;
          auVar22._8_4_ = 3;
          auVar22._0_8_ = 0x300000003;
          auVar22._12_4_ = 3;
          auVar22._16_4_ = 3;
          auVar22._20_4_ = 3;
          auVar22._24_4_ = 3;
          auVar22._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar160,auVar22);
          local_440._0_4_ = (uint)(bVar76 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
          bVar78 = (bool)(bVar76 >> 1 & 1);
          local_440._4_4_ = (uint)bVar78 * auVar96._4_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 2 & 1);
          local_440._8_4_ = (uint)bVar78 * auVar96._8_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 3 & 1);
          local_440._12_4_ = (uint)bVar78 * auVar96._12_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 4 & 1);
          local_440._16_4_ = (uint)bVar78 * auVar96._16_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 5 & 1);
          local_440._20_4_ = (uint)bVar78 * auVar96._20_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 6 & 1);
          local_440._24_4_ = (uint)bVar78 * auVar96._24_4_ | (uint)!bVar78 * 2;
          local_440._28_4_ = (uint)(bVar76 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar76 >> 7) * 2;
          local_520 = vpbroadcastd_avx512vl();
          uVar12 = vpcmpd_avx512vl(local_520,local_440,5);
          local_8b0 = (uint)bVar71;
          bVar71 = (byte)uVar12 & bVar71;
          if (bVar71 == 0) {
            auVar222._8_4_ = 0x7fffffff;
            auVar222._0_8_ = 0x7fffffff7fffffff;
            auVar222._12_4_ = 0x7fffffff;
          }
          else {
            auVar84 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar83 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar85 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar1 = vminps_avx(auVar84,auVar85);
            auVar84 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar85 = vmaxps_avx(auVar83,auVar84);
            auVar192._8_4_ = 0x7fffffff;
            auVar192._0_8_ = 0x7fffffff7fffffff;
            auVar192._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx(auVar1,auVar192);
            auVar84 = vandps_avx(auVar85,auVar192);
            auVar83 = vmaxps_avx(auVar83,auVar84);
            auVar84 = vmovshdup_avx(auVar83);
            auVar84 = vmaxss_avx(auVar84,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar84);
            fVar241 = auVar83._0_4_ * 1.9073486e-06;
            local_740 = vshufps_avx(auVar85,auVar85,0xff);
            local_580 = (float)local_6c0._0_4_ + (float)local_5c0._0_4_;
            fStack_57c = (float)local_6c0._4_4_ + (float)local_5c0._4_4_;
            fStack_578 = fStack_6b8 + fStack_5b8;
            fStack_574 = fStack_6b4 + fStack_5b4;
            fStack_570 = fStack_6b0 + fStack_5b0;
            fStack_56c = fStack_6ac + fStack_5ac;
            fStack_568 = fStack_6a8 + fStack_5a8;
            fStack_564 = fStack_6a4 + fStack_5a4;
            do {
              auVar161._8_4_ = 0x7f800000;
              auVar161._0_8_ = 0x7f8000007f800000;
              auVar161._12_4_ = 0x7f800000;
              auVar161._16_4_ = 0x7f800000;
              auVar161._20_4_ = 0x7f800000;
              auVar161._24_4_ = 0x7f800000;
              auVar161._28_4_ = 0x7f800000;
              auVar96 = vblendmps_avx512vl(auVar161,_local_6c0);
              auVar131._0_4_ =
                   (uint)(bVar71 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar71 & 1) * 0x7f800000;
              bVar78 = (bool)(bVar71 >> 1 & 1);
              auVar131._4_4_ = (uint)bVar78 * auVar96._4_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar71 >> 2 & 1);
              auVar131._8_4_ = (uint)bVar78 * auVar96._8_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar71 >> 3 & 1);
              auVar131._12_4_ = (uint)bVar78 * auVar96._12_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar71 >> 4 & 1);
              auVar131._16_4_ = (uint)bVar78 * auVar96._16_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar71 >> 5 & 1);
              auVar131._20_4_ = (uint)bVar78 * auVar96._20_4_ | (uint)!bVar78 * 0x7f800000;
              auVar131._24_4_ =
                   (uint)(bVar71 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar71 >> 6) * 0x7f800000;
              auVar131._28_4_ = 0x7f800000;
              auVar96 = vshufps_avx(auVar131,auVar131,0xb1);
              auVar96 = vminps_avx(auVar131,auVar96);
              auVar95 = vshufpd_avx(auVar96,auVar96,5);
              auVar96 = vminps_avx(auVar96,auVar95);
              auVar95 = vpermpd_avx2(auVar96,0x4e);
              auVar96 = vminps_avx(auVar96,auVar95);
              uVar12 = vcmpps_avx512vl(auVar131,auVar96,0);
              bVar70 = (byte)uVar12 & bVar71;
              bVar76 = bVar71;
              if (bVar70 != 0) {
                bVar76 = bVar70;
              }
              iVar15 = 0;
              for (uVar80 = (uint)bVar76; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                iVar15 = iVar15 + 1;
              }
              bVar76 = '\x01' << ((byte)iVar15 & 0x1f);
              uVar80 = *(uint *)(local_540 + (uint)(iVar15 << 2));
              uVar139 = *(uint *)(local_1c0 + (uint)(iVar15 << 2));
              fVar243 = local_8a8;
              if ((float)local_7e0._0_4_ < 0.0) {
                fVar243 = sqrtf((float)local_7e0._0_4_);
              }
              auVar248 = ZEXT464(uVar80);
              auVar240 = ZEXT464(uVar139);
              bVar70 = ~bVar76;
              lVar77 = 5;
              do {
                fVar244 = auVar240._0_4_;
                auVar149._4_4_ = fVar244;
                auVar149._0_4_ = fVar244;
                auVar149._8_4_ = fVar244;
                auVar149._12_4_ = fVar244;
                auVar83 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_7d0);
                fVar247 = auVar248._0_4_;
                fVar231 = 1.0 - fVar247;
                fVar237 = fVar231 * fVar231 * fVar231;
                fVar245 = fVar247 * fVar247;
                fVar230 = fVar247 * fVar245;
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar237),
                                          ZEXT416((uint)fVar230));
                fVar236 = fVar247 * fVar231;
                auVar220 = ZEXT416((uint)fVar231);
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * fVar236 * 6.0)),
                                         ZEXT416((uint)(fVar236 * fVar231)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar230),
                                          ZEXT416((uint)fVar237));
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar231 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar247 * fVar236)));
                fVar237 = fVar237 * 0.16666667;
                fVar246 = (auVar84._0_4_ + auVar1._0_4_) * 0.16666667;
                fVar210 = (auVar85._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar230 = fVar230 * 0.16666667;
                auVar193._0_4_ = fVar230 * (float)local_7c0._0_4_;
                auVar193._4_4_ = fVar230 * (float)local_7c0._4_4_;
                auVar193._8_4_ = fVar230 * fStack_7b8;
                auVar193._12_4_ = fVar230 * fStack_7b4;
                auVar221._4_4_ = fVar210;
                auVar221._0_4_ = fVar210;
                auVar221._8_4_ = fVar210;
                auVar221._12_4_ = fVar210;
                auVar84 = vfmadd132ps_fma(auVar221,auVar193,local_780._0_16_);
                auVar194._4_4_ = fVar246;
                auVar194._0_4_ = fVar246;
                auVar194._8_4_ = fVar246;
                auVar194._12_4_ = fVar246;
                auVar84 = vfmadd132ps_fma(auVar194,auVar84,local_7a0._0_16_);
                auVar172._4_4_ = fVar237;
                auVar172._0_4_ = fVar237;
                auVar172._8_4_ = fVar237;
                auVar172._12_4_ = fVar237;
                local_6d0 = vfmadd132ps_fma(auVar172,auVar84,local_760._0_16_);
                auVar83 = vsubps_avx(auVar83,local_6d0);
                local_800._0_16_ = auVar83;
                auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
                auVar84 = auVar248._0_16_;
                local_820._0_16_ = auVar83;
                if (auVar83._0_4_ < 0.0) {
                  local_8a0._0_4_ = fVar245;
                  auVar206._0_4_ = sqrtf(auVar83._0_4_);
                  auVar206._4_60_ = extraout_var;
                  auVar83 = auVar206._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  local_8a0._0_4_ = fVar245;
                }
                auVar1 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar236 * 4.0)));
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * 4.0)),auVar220,auVar220);
                fVar245 = fVar231 * -fVar231 * 0.5;
                fVar236 = auVar1._0_4_ * 0.5;
                fVar237 = auVar85._0_4_ * 0.5;
                local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
                auVar211._0_4_ = (float)local_8a0._0_4_ * (float)local_7c0._0_4_;
                auVar211._4_4_ = (float)local_8a0._0_4_ * (float)local_7c0._4_4_;
                auVar211._8_4_ = (float)local_8a0._0_4_ * fStack_7b8;
                auVar211._12_4_ = (float)local_8a0._0_4_ * fStack_7b4;
                auVar173._4_4_ = fVar237;
                auVar173._0_4_ = fVar237;
                auVar173._8_4_ = fVar237;
                auVar173._12_4_ = fVar237;
                auVar85 = vfmadd132ps_fma(auVar173,auVar211,local_780._0_16_);
                auVar195._4_4_ = fVar236;
                auVar195._0_4_ = fVar236;
                auVar195._8_4_ = fVar236;
                auVar195._12_4_ = fVar236;
                auVar85 = vfmadd132ps_fma(auVar195,auVar85,local_7a0._0_16_);
                auVar253._4_4_ = fVar245;
                auVar253._0_4_ = fVar245;
                auVar253._8_4_ = fVar245;
                auVar253._12_4_ = fVar245;
                local_8a0._0_16_ = vfmadd132ps_fma(auVar253,auVar85,local_760._0_16_);
                local_6f0 = vdpps_avx(local_8a0._0_16_,local_8a0._0_16_,0x7f);
                auVar58._12_4_ = 0;
                auVar58._0_12_ = ZEXT812(0);
                fVar245 = local_6f0._0_4_;
                auVar85 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar245));
                fVar236 = auVar85._0_4_;
                local_700 = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar245));
                auVar85 = vfnmadd213ss_fma(local_700,local_6f0,ZEXT416(0x40000000));
                uVar80 = auVar83._0_4_;
                local_6e0 = fVar231;
                fStack_6dc = fVar231;
                fStack_6d8 = fVar231;
                fStack_6d4 = fVar231;
                if (fVar245 < -fVar245) {
                  fVar237 = sqrtf(fVar245);
                  auVar83 = ZEXT416(uVar80);
                  auVar1 = local_8a0._0_16_;
                }
                else {
                  auVar1 = vsqrtss_avx(local_6f0,local_6f0);
                  fVar237 = auVar1._0_4_;
                  auVar1 = local_8a0._0_16_;
                }
                fVar245 = fVar236 * 1.5 + fVar245 * -0.5 * fVar236 * fVar236 * fVar236;
                auVar150._0_4_ = auVar1._0_4_ * fVar245;
                auVar150._4_4_ = auVar1._4_4_ * fVar245;
                auVar150._8_4_ = auVar1._8_4_ * fVar245;
                auVar150._12_4_ = auVar1._12_4_ * fVar245;
                auVar81 = vdpps_avx(local_800._0_16_,auVar150,0x7f);
                fVar210 = auVar83._0_4_;
                fVar236 = auVar81._0_4_;
                auVar151._0_4_ = fVar236 * fVar236;
                auVar151._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                auVar151._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                auVar151._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                auVar82 = vsubps_avx512vl(local_820._0_16_,auVar151);
                fVar246 = auVar82._0_4_;
                auVar174._4_12_ = ZEXT812(0) << 0x20;
                auVar174._0_4_ = fVar246;
                auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
                auVar87 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
                auVar88 = vmulss_avx512f(auVar82,ZEXT416(0xbf000000));
                if (fVar246 < 0.0) {
                  local_720 = fVar245;
                  fStack_71c = fVar245;
                  fStack_718 = fVar245;
                  fStack_714 = fVar245;
                  local_710 = auVar86;
                  fVar246 = sqrtf(fVar246);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar87 = ZEXT416(auVar87._0_4_);
                  auVar83 = ZEXT416(uVar80);
                  auVar1 = local_8a0._0_16_;
                  auVar86 = local_710;
                  fVar245 = local_720;
                  fVar230 = fStack_71c;
                  fVar231 = fStack_718;
                  fVar238 = fStack_714;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar82,auVar82);
                  fVar246 = auVar82._0_4_;
                  fVar230 = fVar245;
                  fVar231 = fVar245;
                  fVar238 = fVar245;
                }
                auVar255 = ZEXT1664(auVar1);
                auVar242 = ZEXT1664(local_800._0_16_);
                auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar259 = ZEXT3264(auVar96);
                auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar220,auVar84);
                auVar84 = vfmadd231ss_fma(auVar220,auVar84,SUB6416(ZEXT464(0xc0000000),0));
                auVar196._0_4_ = fVar247 * (float)local_7c0._0_4_;
                auVar196._4_4_ = fVar247 * (float)local_7c0._4_4_;
                auVar196._8_4_ = fVar247 * fStack_7b8;
                auVar196._12_4_ = fVar247 * fStack_7b4;
                auVar212._0_4_ = auVar84._0_4_;
                auVar212._4_4_ = auVar212._0_4_;
                auVar212._8_4_ = auVar212._0_4_;
                auVar212._12_4_ = auVar212._0_4_;
                auVar84 = vfmadd132ps_fma(auVar212,auVar196,local_780._0_16_);
                auVar175._0_4_ = auVar82._0_4_;
                auVar175._4_4_ = auVar175._0_4_;
                auVar175._8_4_ = auVar175._0_4_;
                auVar175._12_4_ = auVar175._0_4_;
                auVar84 = vfmadd132ps_fma(auVar175,auVar84,local_7a0._0_16_);
                auVar64._4_4_ = fStack_6dc;
                auVar64._0_4_ = local_6e0;
                auVar64._8_4_ = fStack_6d8;
                auVar64._12_4_ = fStack_6d4;
                auVar84 = vfmadd132ps_fma(auVar64,auVar84,local_760._0_16_);
                auVar176._0_4_ = auVar84._0_4_ * (float)local_6f0._0_4_;
                auVar176._4_4_ = auVar84._4_4_ * (float)local_6f0._0_4_;
                auVar176._8_4_ = auVar84._8_4_ * (float)local_6f0._0_4_;
                auVar176._12_4_ = auVar84._12_4_ * (float)local_6f0._0_4_;
                auVar84 = vdpps_avx(auVar1,auVar84,0x7f);
                fVar191 = auVar84._0_4_;
                auVar197._0_4_ = auVar1._0_4_ * fVar191;
                auVar197._4_4_ = auVar1._4_4_ * fVar191;
                auVar197._8_4_ = auVar1._8_4_ * fVar191;
                auVar197._12_4_ = auVar1._12_4_ * fVar191;
                auVar84 = vsubps_avx(auVar176,auVar197);
                fVar191 = auVar85._0_4_ * (float)local_700._0_4_;
                auVar220 = vmaxss_avx(ZEXT416((uint)fVar241),
                                      ZEXT416((uint)(fVar244 * fVar243 * 1.9073486e-06)));
                auVar16._8_4_ = 0x80000000;
                auVar16._0_8_ = 0x8000000080000000;
                auVar16._12_4_ = 0x80000000;
                auVar133._16_16_ = auVar96._16_16_;
                auVar89 = vxorps_avx512vl(auVar1,auVar16);
                auVar198._0_4_ = fVar245 * auVar84._0_4_ * fVar191;
                auVar198._4_4_ = fVar230 * auVar84._4_4_ * fVar191;
                auVar198._8_4_ = fVar231 * auVar84._8_4_ * fVar191;
                auVar198._12_4_ = fVar238 * auVar84._12_4_ * fVar191;
                auVar250 = ZEXT1664(auVar150);
                auVar84 = vdpps_avx(auVar89,auVar150,0x7f);
                auVar85 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar241),auVar220);
                auVar83 = vdpps_avx(local_800._0_16_,auVar198,0x7f);
                auVar82 = vfmadd213ss_fma(ZEXT416((uint)(fVar210 + 1.0)),
                                          ZEXT416((uint)(fVar241 / fVar237)),auVar85);
                auVar257 = ZEXT1664(auVar82);
                fVar245 = auVar84._0_4_ + auVar83._0_4_;
                auVar83 = vdpps_avx(local_7d0,auVar150,0x7f);
                auVar84 = vdpps_avx(local_800._0_16_,auVar89,0x7f);
                auVar85 = vmulss_avx512f(auVar88,auVar86);
                auVar88 = vaddss_avx512f(auVar87,ZEXT416((uint)(auVar85._0_4_ *
                                                               auVar86._0_4_ * auVar86._0_4_)));
                auVar85 = vdpps_avx(local_800._0_16_,local_7d0,0x7f);
                auVar86 = vfnmadd231ss_fma(auVar84,auVar81,ZEXT416((uint)fVar245));
                auVar87 = vfnmadd231ss_fma(auVar85,auVar81,auVar83);
                auVar84 = vpermilps_avx(local_6d0,0xff);
                fVar246 = fVar246 - auVar84._0_4_;
                auVar84 = vshufps_avx(auVar1,auVar1,0xff);
                auVar85 = vfmsub213ss_fma(auVar86,auVar88,auVar84);
                fVar237 = auVar87._0_4_ * auVar88._0_4_;
                auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar245),ZEXT416((uint)fVar237));
                fVar210 = auVar86._0_4_;
                fVar237 = fVar236 * (fVar237 / fVar210) - fVar246 * (auVar83._0_4_ / fVar210);
                auVar232 = ZEXT464((uint)fVar237);
                fVar247 = fVar247 - fVar237;
                auVar248 = ZEXT464((uint)fVar247);
                fVar244 = fVar244 - (fVar246 * (fVar245 / fVar210) -
                                    fVar236 * (auVar85._0_4_ / fVar210));
                auVar240 = ZEXT464((uint)fVar244);
                auVar222._8_4_ = 0x7fffffff;
                auVar222._0_8_ = 0x7fffffff7fffffff;
                auVar222._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx(auVar81,auVar222);
                bVar78 = true;
                if (auVar83._0_4_ < auVar82._0_4_) {
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ + auVar220._0_4_)),
                                            local_740,ZEXT416(0x36000000));
                  auVar83 = vandps_avx(ZEXT416((uint)fVar246),auVar222);
                  if (auVar83._0_4_ < auVar85._0_4_) {
                    fVar244 = fVar244 + (float)local_730._0_4_;
                    auVar240 = ZEXT464((uint)fVar244);
                    if (fVar146 <= fVar244) {
                      fVar245 = *(float *)(ray + k * 4 + 0x80);
                      auVar232 = ZEXT464((uint)fVar245);
                      if (((fVar244 <= fVar245) && (0.0 <= fVar247)) && (fVar247 <= 1.0)) {
                        auVar133._0_16_ = ZEXT816(0) << 0x20;
                        auVar132._4_28_ = auVar133._4_28_;
                        auVar132._0_4_ = local_820._0_4_;
                        auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar132._0_16_);
                        fVar236 = auVar83._0_4_;
                        auVar83 = vmulss_avx512f(local_820._0_16_,ZEXT416(0xbf000000));
                        pGVar3 = (context->scene->geometries).items[local_8c8].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            bVar76 = true;
                          }
                          else {
                            fVar236 = fVar236 * 1.5 + auVar83._0_4_ * fVar236 * fVar236 * fVar236;
                            auVar177._0_4_ = local_800._0_4_ * fVar236;
                            auVar177._4_4_ = local_800._4_4_ * fVar236;
                            auVar177._8_4_ = local_800._8_4_ * fVar236;
                            auVar177._12_4_ = local_800._12_4_ * fVar236;
                            auVar81 = vfmadd213ps_fma(auVar84,auVar177,auVar1);
                            auVar83 = vshufps_avx(auVar177,auVar177,0xc9);
                            auVar84 = vshufps_avx(auVar1,auVar1,0xc9);
                            auVar178._0_4_ = auVar177._0_4_ * auVar84._0_4_;
                            auVar178._4_4_ = auVar177._4_4_ * auVar84._4_4_;
                            auVar178._8_4_ = auVar177._8_4_ * auVar84._8_4_;
                            auVar178._12_4_ = auVar177._12_4_ * auVar84._12_4_;
                            auVar85 = vfmsub231ps_fma(auVar178,auVar1,auVar83);
                            auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
                            auVar84 = vshufps_avx(auVar81,auVar81,0xc9);
                            auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                            auVar152._0_4_ = auVar81._0_4_ * auVar85._0_4_;
                            auVar152._4_4_ = auVar81._4_4_ * auVar85._4_4_;
                            auVar152._8_4_ = auVar81._8_4_ * auVar85._8_4_;
                            auVar152._12_4_ = auVar81._12_4_ * auVar85._12_4_;
                            auVar83 = vfmsub231ps_fma(auVar152,auVar83,auVar84);
                            local_660 = (RTCHitN  [16])vshufps_avx(auVar83,auVar83,0x55);
                            auStack_650 = vshufps_avx(auVar83,auVar83,0xaa);
                            local_640 = auVar83._0_4_;
                            uStack_63c = local_640;
                            uStack_638 = local_640;
                            uStack_634 = local_640;
                            local_630 = fVar247;
                            fStack_62c = fVar247;
                            fStack_628 = fVar247;
                            fStack_624 = fVar247;
                            local_620 = ZEXT416(0) << 0x20;
                            local_610 = local_670._0_8_;
                            uStack_608 = local_670._8_8_;
                            local_600 = local_680;
                            vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                            uStack_5ec = context->user->instID[0];
                            local_5f0 = uStack_5ec;
                            uStack_5e8 = uStack_5ec;
                            uStack_5e4 = uStack_5ec;
                            uStack_5e0 = context->user->instPrimID[0];
                            uStack_5dc = uStack_5e0;
                            uStack_5d8 = uStack_5e0;
                            uStack_5d4 = uStack_5e0;
                            *(float *)(ray + k * 4 + 0x80) = fVar244;
                            local_8e0 = local_690._0_8_;
                            uStack_8d8 = local_690._8_8_;
                            local_850.valid = (int *)&local_8e0;
                            local_850.geometryUserPtr = pGVar3->userPtr;
                            local_850.context = context->user;
                            local_850.hit = local_660;
                            local_850.N = 4;
                            local_850.ray = (RTCRayN *)ray;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar242 = ZEXT1664(local_800._0_16_);
                              auVar250 = ZEXT1664(auVar150);
                              auVar255 = ZEXT1664(auVar1);
                              auVar257 = ZEXT1664(auVar82);
                              (*pGVar3->occlusionFilterN)(&local_850);
                              auVar240 = ZEXT1664(ZEXT416((uint)fVar244));
                              auVar248 = ZEXT1664(ZEXT416((uint)fVar247));
                              auVar222._8_4_ = 0x7fffffff;
                              auVar222._0_8_ = 0x7fffffff7fffffff;
                              auVar222._12_4_ = 0x7fffffff;
                              auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar259 = ZEXT3264(auVar96);
                            }
                            auVar60._8_8_ = uStack_8d8;
                            auVar60._0_8_ = local_8e0;
                            uVar74 = vptestmd_avx512vl(auVar60,auVar60);
                            if ((uVar74 & 0xf) == 0) {
                              bVar76 = false;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar242 = ZEXT1664(auVar242._0_16_);
                                auVar250 = ZEXT1664(auVar250._0_16_);
                                auVar255 = ZEXT1664(auVar255._0_16_);
                                auVar257 = ZEXT1664(auVar257._0_16_);
                                (*p_Var4)(&local_850);
                                auVar240 = ZEXT1664(ZEXT416((uint)fVar244));
                                auVar248 = ZEXT1664(ZEXT416((uint)fVar247));
                                auVar222._8_4_ = 0x7fffffff;
                                auVar222._0_8_ = 0x7fffffff7fffffff;
                                auVar222._12_4_ = 0x7fffffff;
                                auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar259 = ZEXT3264(auVar96);
                              }
                              auVar61._8_8_ = uStack_8d8;
                              auVar61._0_8_ = local_8e0;
                              uVar74 = vptestmd_avx512vl(auVar61,auVar61);
                              uVar74 = uVar74 & 0xf;
                              auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              bVar78 = (bool)((byte)uVar74 & 1);
                              bVar5 = (bool)((byte)(uVar74 >> 1) & 1);
                              bVar6 = (bool)((byte)(uVar74 >> 2) & 1);
                              bVar7 = SUB81(uVar74 >> 3,0);
                              *(uint *)(local_850.ray + 0x80) =
                                   (uint)bVar78 * auVar83._0_4_ |
                                   (uint)!bVar78 * *(int *)(local_850.ray + 0x80);
                              *(uint *)(local_850.ray + 0x84) =
                                   (uint)bVar5 * auVar83._4_4_ |
                                   (uint)!bVar5 * *(int *)(local_850.ray + 0x84);
                              *(uint *)(local_850.ray + 0x88) =
                                   (uint)bVar6 * auVar83._8_4_ |
                                   (uint)!bVar6 * *(int *)(local_850.ray + 0x88);
                              *(uint *)(local_850.ray + 0x8c) =
                                   (uint)bVar7 * auVar83._12_4_ |
                                   (uint)!bVar7 * *(int *)(local_850.ray + 0x8c);
                              bVar76 = (byte)uVar74 != 0;
                            }
                            if ((bool)bVar76 == false) {
                              *(float *)(ray + k * 4 + 0x80) = fVar245;
                            }
                          }
                          auVar232 = ZEXT464((uint)fVar245);
                          bVar78 = false;
                          goto LAB_01e0c2c2;
                        }
                      }
                    }
                    bVar78 = false;
                    bVar76 = 0;
                  }
                }
LAB_01e0c2c2:
                if (!bVar78) goto LAB_01e0c5ea;
                lVar77 = lVar77 + -1;
              } while (lVar77 != 0);
              bVar76 = 0;
LAB_01e0c5ea:
              bVar75 = bVar75 | bVar76 & 1;
              auVar66._4_4_ = fStack_57c;
              auVar66._0_4_ = local_580;
              auVar66._8_4_ = fStack_578;
              auVar66._12_4_ = fStack_574;
              auVar66._16_4_ = fStack_570;
              auVar66._20_4_ = fStack_56c;
              auVar66._24_4_ = fStack_568;
              auVar66._28_4_ = fStack_564;
              uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar23._4_4_ = uVar147;
              auVar23._0_4_ = uVar147;
              auVar23._8_4_ = uVar147;
              auVar23._12_4_ = uVar147;
              auVar23._16_4_ = uVar147;
              auVar23._20_4_ = uVar147;
              auVar23._24_4_ = uVar147;
              auVar23._28_4_ = uVar147;
              uVar12 = vcmpps_avx512vl(auVar66,auVar23,2);
              bVar71 = bVar70 & bVar71 & (byte)uVar12;
            } while (bVar71 != 0);
          }
          auVar162._0_4_ = (float)local_5c0._0_4_ + (float)local_5a0._0_4_;
          auVar162._4_4_ = (float)local_5c0._4_4_ + (float)local_5a0._4_4_;
          auVar162._8_4_ = fStack_5b8 + fStack_598;
          auVar162._12_4_ = fStack_5b4 + fStack_594;
          auVar162._16_4_ = fStack_5b0 + fStack_590;
          auVar162._20_4_ = fStack_5ac + fStack_58c;
          auVar162._24_4_ = fStack_5a8 + fStack_588;
          auVar162._28_4_ = fStack_5a4 + fStack_584;
          uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar24._4_4_ = uVar147;
          auVar24._0_4_ = uVar147;
          auVar24._8_4_ = uVar147;
          auVar24._12_4_ = uVar147;
          auVar24._16_4_ = uVar147;
          auVar24._20_4_ = uVar147;
          auVar24._24_4_ = uVar147;
          auVar24._28_4_ = uVar147;
          uVar12 = vcmpps_avx512vl(auVar162,auVar24,2);
          bVar76 = (byte)local_8ac | (byte)local_8b4;
          bVar69 = (byte)uVar13 & bVar69 & (byte)uVar12;
          auVar163._8_4_ = 2;
          auVar163._0_8_ = 0x200000002;
          auVar163._12_4_ = 2;
          auVar163._16_4_ = 2;
          auVar163._20_4_ = 2;
          auVar163._24_4_ = 2;
          auVar163._28_4_ = 2;
          auVar25._8_4_ = 3;
          auVar25._0_8_ = 0x300000003;
          auVar25._12_4_ = 3;
          auVar25._16_4_ = 3;
          auVar25._20_4_ = 3;
          auVar25._24_4_ = 3;
          auVar25._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar163,auVar25);
          local_5a0._0_4_ = (uint)(bVar76 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
          bVar78 = (bool)(bVar76 >> 1 & 1);
          local_5a0._4_4_ = (uint)bVar78 * auVar96._4_4_ | (uint)!bVar78 * 2;
          bVar78 = (bool)(bVar76 >> 2 & 1);
          fStack_598 = (float)((uint)bVar78 * auVar96._8_4_ | (uint)!bVar78 * 2);
          bVar78 = (bool)(bVar76 >> 3 & 1);
          fStack_594 = (float)((uint)bVar78 * auVar96._12_4_ | (uint)!bVar78 * 2);
          bVar78 = (bool)(bVar76 >> 4 & 1);
          fStack_590 = (float)((uint)bVar78 * auVar96._16_4_ | (uint)!bVar78 * 2);
          bVar78 = (bool)(bVar76 >> 5 & 1);
          fStack_58c = (float)((uint)bVar78 * auVar96._20_4_ | (uint)!bVar78 * 2);
          bVar78 = (bool)(bVar76 >> 6 & 1);
          fStack_588 = (float)((uint)bVar78 * auVar96._24_4_ | (uint)!bVar78 * 2);
          fStack_584 = (float)((uint)(bVar76 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar76 >> 7) * 2
                              );
          uVar12 = vpcmpd_avx512vl(_local_5a0,local_520,2);
          bVar76 = (byte)uVar12 & bVar69;
          if (bVar76 != 0) {
            auVar84 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar83 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar85 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar1 = vminps_avx(auVar84,auVar85);
            auVar84 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar85 = vmaxps_avx(auVar83,auVar84);
            auVar83 = vandps_avx(auVar1,auVar222);
            auVar84 = vandps_avx(auVar85,auVar222);
            auVar83 = vmaxps_avx(auVar83,auVar84);
            auVar84 = vmovshdup_avx(auVar83);
            auVar84 = vmaxss_avx(auVar84,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar84);
            fVar241 = auVar83._0_4_ * 1.9073486e-06;
            local_740 = vshufps_avx(auVar85,auVar85,0xff);
            _local_6c0 = _local_480;
            local_580 = (float)local_5c0._0_4_ + (float)local_480._0_4_;
            fStack_57c = (float)local_5c0._4_4_ + (float)local_480._4_4_;
            fStack_578 = fStack_5b8 + fStack_478;
            fStack_574 = fStack_5b4 + fStack_474;
            fStack_570 = fStack_5b0 + fStack_470;
            fStack_56c = fStack_5ac + fStack_46c;
            fStack_568 = fStack_5a8 + fStack_468;
            fStack_564 = fStack_5a4 + fStack_464;
            do {
              auVar164._8_4_ = 0x7f800000;
              auVar164._0_8_ = 0x7f8000007f800000;
              auVar164._12_4_ = 0x7f800000;
              auVar164._16_4_ = 0x7f800000;
              auVar164._20_4_ = 0x7f800000;
              auVar164._24_4_ = 0x7f800000;
              auVar164._28_4_ = 0x7f800000;
              auVar96 = vblendmps_avx512vl(auVar164,_local_6c0);
              auVar134._0_4_ =
                   (uint)(bVar76 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar76 & 1) * 0x7f800000;
              bVar78 = (bool)(bVar76 >> 1 & 1);
              auVar134._4_4_ = (uint)bVar78 * auVar96._4_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar76 >> 2 & 1);
              auVar134._8_4_ = (uint)bVar78 * auVar96._8_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar76 >> 3 & 1);
              auVar134._12_4_ = (uint)bVar78 * auVar96._12_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar76 >> 4 & 1);
              auVar134._16_4_ = (uint)bVar78 * auVar96._16_4_ | (uint)!bVar78 * 0x7f800000;
              bVar78 = (bool)(bVar76 >> 5 & 1);
              auVar134._20_4_ = (uint)bVar78 * auVar96._20_4_ | (uint)!bVar78 * 0x7f800000;
              auVar134._24_4_ =
                   (uint)(bVar76 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar76 >> 6) * 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar96 = vshufps_avx(auVar134,auVar134,0xb1);
              auVar96 = vminps_avx(auVar134,auVar96);
              auVar95 = vshufpd_avx(auVar96,auVar96,5);
              auVar96 = vminps_avx(auVar96,auVar95);
              auVar95 = vpermpd_avx2(auVar96,0x4e);
              auVar96 = vminps_avx(auVar96,auVar95);
              uVar12 = vcmpps_avx512vl(auVar134,auVar96,0);
              bVar70 = (byte)uVar12 & bVar76;
              bVar71 = bVar76;
              if (bVar70 != 0) {
                bVar71 = bVar70;
              }
              iVar15 = 0;
              for (uVar80 = (uint)bVar71; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                iVar15 = iVar15 + 1;
              }
              bVar71 = '\x01' << ((byte)iVar15 & 0x1f);
              uVar80 = *(uint *)(local_560 + (uint)(iVar15 << 2));
              uVar139 = *(uint *)(local_460 + (uint)(iVar15 << 2));
              fVar243 = local_8a4;
              if ((float)local_7e0._0_4_ < 0.0) {
                fVar243 = sqrtf((float)local_7e0._0_4_);
              }
              auVar248 = ZEXT464(uVar80);
              auVar240 = ZEXT464(uVar139);
              bVar70 = ~bVar71;
              lVar77 = 5;
              do {
                fVar244 = auVar240._0_4_;
                auVar153._4_4_ = fVar244;
                auVar153._0_4_ = fVar244;
                auVar153._8_4_ = fVar244;
                auVar153._12_4_ = fVar244;
                auVar83 = vfmadd132ps_fma(auVar153,ZEXT816(0) << 0x40,local_7d0);
                fVar247 = auVar248._0_4_;
                fVar231 = 1.0 - fVar247;
                fVar237 = fVar231 * fVar231 * fVar231;
                fVar245 = fVar247 * fVar247;
                fVar230 = fVar247 * fVar245;
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar237),
                                          ZEXT416((uint)fVar230));
                fVar236 = fVar247 * fVar231;
                auVar220 = ZEXT416((uint)fVar231);
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * fVar236 * 6.0)),
                                         ZEXT416((uint)(fVar236 * fVar231)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar230),
                                          ZEXT416((uint)fVar237));
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar231 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar247 * fVar236)));
                fVar237 = fVar237 * 0.16666667;
                fVar246 = (auVar84._0_4_ + auVar1._0_4_) * 0.16666667;
                fVar210 = (auVar85._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar230 = fVar230 * 0.16666667;
                auVar199._0_4_ = fVar230 * (float)local_7c0._0_4_;
                auVar199._4_4_ = fVar230 * (float)local_7c0._4_4_;
                auVar199._8_4_ = fVar230 * fStack_7b8;
                auVar199._12_4_ = fVar230 * fStack_7b4;
                auVar223._4_4_ = fVar210;
                auVar223._0_4_ = fVar210;
                auVar223._8_4_ = fVar210;
                auVar223._12_4_ = fVar210;
                auVar84 = vfmadd132ps_fma(auVar223,auVar199,local_780._0_16_);
                auVar200._4_4_ = fVar246;
                auVar200._0_4_ = fVar246;
                auVar200._8_4_ = fVar246;
                auVar200._12_4_ = fVar246;
                auVar84 = vfmadd132ps_fma(auVar200,auVar84,local_7a0._0_16_);
                auVar179._4_4_ = fVar237;
                auVar179._0_4_ = fVar237;
                auVar179._8_4_ = fVar237;
                auVar179._12_4_ = fVar237;
                local_6d0 = vfmadd132ps_fma(auVar179,auVar84,local_760._0_16_);
                auVar83 = vsubps_avx(auVar83,local_6d0);
                local_800._0_16_ = auVar83;
                auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
                auVar84 = auVar248._0_16_;
                local_820._0_16_ = auVar83;
                if (auVar83._0_4_ < 0.0) {
                  local_8a0._0_4_ = fVar245;
                  auVar232._0_4_ = sqrtf(auVar83._0_4_);
                  auVar232._4_60_ = extraout_var_00;
                  auVar83 = auVar232._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  local_8a0._0_4_ = fVar245;
                }
                auVar1 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar236 * 4.0)));
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * 4.0)),auVar220,auVar220);
                fVar245 = fVar231 * -fVar231 * 0.5;
                fVar236 = auVar1._0_4_ * 0.5;
                fVar237 = auVar85._0_4_ * 0.5;
                local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
                auVar213._0_4_ = (float)local_8a0._0_4_ * (float)local_7c0._0_4_;
                auVar213._4_4_ = (float)local_8a0._0_4_ * (float)local_7c0._4_4_;
                auVar213._8_4_ = (float)local_8a0._0_4_ * fStack_7b8;
                auVar213._12_4_ = (float)local_8a0._0_4_ * fStack_7b4;
                auVar180._4_4_ = fVar237;
                auVar180._0_4_ = fVar237;
                auVar180._8_4_ = fVar237;
                auVar180._12_4_ = fVar237;
                auVar85 = vfmadd132ps_fma(auVar180,auVar213,local_780._0_16_);
                auVar201._4_4_ = fVar236;
                auVar201._0_4_ = fVar236;
                auVar201._8_4_ = fVar236;
                auVar201._12_4_ = fVar236;
                auVar85 = vfmadd132ps_fma(auVar201,auVar85,local_7a0._0_16_);
                auVar254._4_4_ = fVar245;
                auVar254._0_4_ = fVar245;
                auVar254._8_4_ = fVar245;
                auVar254._12_4_ = fVar245;
                local_8a0._0_16_ = vfmadd132ps_fma(auVar254,auVar85,local_760._0_16_);
                local_6f0 = vdpps_avx(local_8a0._0_16_,local_8a0._0_16_,0x7f);
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                fVar245 = local_6f0._0_4_;
                auVar85 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar245));
                fVar236 = auVar85._0_4_;
                local_700 = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar245));
                auVar85 = vfnmadd213ss_fma(local_700,local_6f0,ZEXT416(0x40000000));
                uVar80 = auVar83._0_4_;
                local_6e0 = fVar231;
                fStack_6dc = fVar231;
                fStack_6d8 = fVar231;
                fStack_6d4 = fVar231;
                if (fVar245 < -fVar245) {
                  fVar237 = sqrtf(fVar245);
                  auVar83 = ZEXT416(uVar80);
                  auVar1 = local_8a0._0_16_;
                }
                else {
                  auVar1 = vsqrtss_avx(local_6f0,local_6f0);
                  fVar237 = auVar1._0_4_;
                  auVar1 = local_8a0._0_16_;
                }
                fVar245 = fVar236 * 1.5 + fVar245 * -0.5 * fVar236 * fVar236 * fVar236;
                auVar154._0_4_ = auVar1._0_4_ * fVar245;
                auVar154._4_4_ = auVar1._4_4_ * fVar245;
                auVar154._8_4_ = auVar1._8_4_ * fVar245;
                auVar154._12_4_ = auVar1._12_4_ * fVar245;
                auVar81 = vdpps_avx(local_800._0_16_,auVar154,0x7f);
                fVar210 = auVar83._0_4_;
                fVar236 = auVar81._0_4_;
                auVar155._0_4_ = fVar236 * fVar236;
                auVar155._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                auVar155._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                auVar155._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                auVar82 = vsubps_avx512vl(local_820._0_16_,auVar155);
                fVar246 = auVar82._0_4_;
                auVar181._4_12_ = ZEXT812(0) << 0x20;
                auVar181._0_4_ = fVar246;
                auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
                auVar87 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
                auVar88 = vmulss_avx512f(auVar82,ZEXT416(0xbf000000));
                if (fVar246 < 0.0) {
                  local_720 = fVar245;
                  fStack_71c = fVar245;
                  fStack_718 = fVar245;
                  fStack_714 = fVar245;
                  local_710 = auVar86;
                  fVar246 = sqrtf(fVar246);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar87 = ZEXT416(auVar87._0_4_);
                  auVar83 = ZEXT416(uVar80);
                  auVar1 = local_8a0._0_16_;
                  auVar86 = local_710;
                  fVar245 = local_720;
                  fVar230 = fStack_71c;
                  fVar231 = fStack_718;
                  fVar238 = fStack_714;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar82,auVar82);
                  fVar246 = auVar82._0_4_;
                  fVar230 = fVar245;
                  fVar231 = fVar245;
                  fVar238 = fVar245;
                }
                auVar255 = ZEXT1664(auVar1);
                auVar242 = ZEXT1664(local_800._0_16_);
                auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar259 = ZEXT3264(auVar96);
                auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar220,auVar84);
                auVar84 = vfmadd231ss_fma(auVar220,auVar84,SUB6416(ZEXT464(0xc0000000),0));
                auVar202._0_4_ = fVar247 * (float)local_7c0._0_4_;
                auVar202._4_4_ = fVar247 * (float)local_7c0._4_4_;
                auVar202._8_4_ = fVar247 * fStack_7b8;
                auVar202._12_4_ = fVar247 * fStack_7b4;
                auVar214._0_4_ = auVar84._0_4_;
                auVar214._4_4_ = auVar214._0_4_;
                auVar214._8_4_ = auVar214._0_4_;
                auVar214._12_4_ = auVar214._0_4_;
                auVar84 = vfmadd132ps_fma(auVar214,auVar202,local_780._0_16_);
                auVar182._0_4_ = auVar82._0_4_;
                auVar182._4_4_ = auVar182._0_4_;
                auVar182._8_4_ = auVar182._0_4_;
                auVar182._12_4_ = auVar182._0_4_;
                auVar84 = vfmadd132ps_fma(auVar182,auVar84,local_7a0._0_16_);
                auVar65._4_4_ = fStack_6dc;
                auVar65._0_4_ = local_6e0;
                auVar65._8_4_ = fStack_6d8;
                auVar65._12_4_ = fStack_6d4;
                auVar84 = vfmadd132ps_fma(auVar65,auVar84,local_760._0_16_);
                auVar183._0_4_ = auVar84._0_4_ * (float)local_6f0._0_4_;
                auVar183._4_4_ = auVar84._4_4_ * (float)local_6f0._0_4_;
                auVar183._8_4_ = auVar84._8_4_ * (float)local_6f0._0_4_;
                auVar183._12_4_ = auVar84._12_4_ * (float)local_6f0._0_4_;
                auVar84 = vdpps_avx(auVar1,auVar84,0x7f);
                fVar191 = auVar84._0_4_;
                auVar203._0_4_ = auVar1._0_4_ * fVar191;
                auVar203._4_4_ = auVar1._4_4_ * fVar191;
                auVar203._8_4_ = auVar1._8_4_ * fVar191;
                auVar203._12_4_ = auVar1._12_4_ * fVar191;
                auVar84 = vsubps_avx(auVar183,auVar203);
                fVar191 = auVar85._0_4_ * (float)local_700._0_4_;
                auVar220 = vmaxss_avx(ZEXT416((uint)fVar241),
                                      ZEXT416((uint)(fVar244 * fVar243 * 1.9073486e-06)));
                auVar17._8_4_ = 0x80000000;
                auVar17._0_8_ = 0x8000000080000000;
                auVar17._12_4_ = 0x80000000;
                auVar136._16_16_ = auVar96._16_16_;
                auVar89 = vxorps_avx512vl(auVar1,auVar17);
                auVar204._0_4_ = fVar245 * auVar84._0_4_ * fVar191;
                auVar204._4_4_ = fVar230 * auVar84._4_4_ * fVar191;
                auVar204._8_4_ = fVar231 * auVar84._8_4_ * fVar191;
                auVar204._12_4_ = fVar238 * auVar84._12_4_ * fVar191;
                auVar250 = ZEXT1664(auVar154);
                auVar84 = vdpps_avx(auVar89,auVar154,0x7f);
                auVar85 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar241),auVar220);
                auVar83 = vdpps_avx(local_800._0_16_,auVar204,0x7f);
                auVar82 = vfmadd213ss_fma(ZEXT416((uint)(fVar210 + 1.0)),
                                          ZEXT416((uint)(fVar241 / fVar237)),auVar85);
                auVar257 = ZEXT1664(auVar82);
                fVar245 = auVar84._0_4_ + auVar83._0_4_;
                auVar83 = vdpps_avx(local_7d0,auVar154,0x7f);
                auVar84 = vdpps_avx(local_800._0_16_,auVar89,0x7f);
                auVar85 = vmulss_avx512f(auVar88,auVar86);
                auVar88 = vaddss_avx512f(auVar87,ZEXT416((uint)(auVar85._0_4_ *
                                                               auVar86._0_4_ * auVar86._0_4_)));
                auVar85 = vdpps_avx(local_800._0_16_,local_7d0,0x7f);
                auVar86 = vfnmadd231ss_fma(auVar84,auVar81,ZEXT416((uint)fVar245));
                auVar87 = vfnmadd231ss_fma(auVar85,auVar81,auVar83);
                auVar84 = vpermilps_avx(local_6d0,0xff);
                fVar246 = fVar246 - auVar84._0_4_;
                auVar84 = vshufps_avx(auVar1,auVar1,0xff);
                auVar85 = vfmsub213ss_fma(auVar86,auVar88,auVar84);
                fVar237 = auVar87._0_4_ * auVar88._0_4_;
                auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar245),ZEXT416((uint)fVar237));
                fVar210 = auVar86._0_4_;
                fVar237 = fVar236 * (fVar237 / fVar210) - fVar246 * (auVar83._0_4_ / fVar210);
                auVar232 = ZEXT464((uint)fVar237);
                fVar247 = fVar247 - fVar237;
                auVar248 = ZEXT464((uint)fVar247);
                fVar244 = fVar244 - (fVar246 * (fVar245 / fVar210) -
                                    fVar236 * (auVar85._0_4_ / fVar210));
                auVar240 = ZEXT464((uint)fVar244);
                auVar224._8_4_ = 0x7fffffff;
                auVar224._0_8_ = 0x7fffffff7fffffff;
                auVar224._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx(auVar81,auVar224);
                bVar78 = true;
                if (auVar83._0_4_ < auVar82._0_4_) {
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ + auVar220._0_4_)),
                                            local_740,ZEXT416(0x36000000));
                  auVar83 = vandps_avx(ZEXT416((uint)fVar246),auVar224);
                  if (auVar83._0_4_ < auVar85._0_4_) {
                    fVar244 = fVar244 + (float)local_730._0_4_;
                    auVar240 = ZEXT464((uint)fVar244);
                    if ((((fVar146 <= fVar244) &&
                         (fVar245 = *(float *)(ray + k * 4 + 0x80), fVar244 <= fVar245)) &&
                        (0.0 <= fVar247)) && (fVar247 <= 1.0)) {
                      auVar136._0_16_ = ZEXT816(0) << 0x20;
                      auVar135._4_28_ = auVar136._4_28_;
                      auVar135._0_4_ = local_820._0_4_;
                      auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar135._0_16_);
                      fVar236 = auVar83._0_4_;
                      auVar83 = vmulss_avx512f(local_820._0_16_,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[local_8c8].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          bVar71 = true;
                        }
                        else {
                          fVar236 = fVar236 * 1.5 + auVar83._0_4_ * fVar236 * fVar236 * fVar236;
                          auVar184._0_4_ = local_800._0_4_ * fVar236;
                          auVar184._4_4_ = local_800._4_4_ * fVar236;
                          auVar184._8_4_ = local_800._8_4_ * fVar236;
                          auVar184._12_4_ = local_800._12_4_ * fVar236;
                          auVar81 = vfmadd213ps_fma(auVar84,auVar184,auVar1);
                          auVar83 = vshufps_avx(auVar184,auVar184,0xc9);
                          auVar84 = vshufps_avx(auVar1,auVar1,0xc9);
                          auVar185._0_4_ = auVar184._0_4_ * auVar84._0_4_;
                          auVar185._4_4_ = auVar184._4_4_ * auVar84._4_4_;
                          auVar185._8_4_ = auVar184._8_4_ * auVar84._8_4_;
                          auVar185._12_4_ = auVar184._12_4_ * auVar84._12_4_;
                          auVar85 = vfmsub231ps_fma(auVar185,auVar1,auVar83);
                          auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
                          auVar84 = vshufps_avx(auVar81,auVar81,0xc9);
                          auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                          auVar156._0_4_ = auVar81._0_4_ * auVar85._0_4_;
                          auVar156._4_4_ = auVar81._4_4_ * auVar85._4_4_;
                          auVar156._8_4_ = auVar81._8_4_ * auVar85._8_4_;
                          auVar156._12_4_ = auVar81._12_4_ * auVar85._12_4_;
                          auVar83 = vfmsub231ps_fma(auVar156,auVar83,auVar84);
                          local_660 = (RTCHitN  [16])vshufps_avx(auVar83,auVar83,0x55);
                          auStack_650 = vshufps_avx(auVar83,auVar83,0xaa);
                          local_640 = auVar83._0_4_;
                          uStack_63c = local_640;
                          uStack_638 = local_640;
                          uStack_634 = local_640;
                          local_630 = fVar247;
                          fStack_62c = fVar247;
                          fStack_628 = fVar247;
                          fStack_624 = fVar247;
                          local_620 = ZEXT416(0) << 0x20;
                          local_610 = local_670._0_8_;
                          uStack_608 = local_670._8_8_;
                          local_600 = local_680;
                          vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                          uStack_5ec = context->user->instID[0];
                          local_5f0 = uStack_5ec;
                          uStack_5e8 = uStack_5ec;
                          uStack_5e4 = uStack_5ec;
                          uStack_5e0 = context->user->instPrimID[0];
                          uStack_5dc = uStack_5e0;
                          uStack_5d8 = uStack_5e0;
                          uStack_5d4 = uStack_5e0;
                          *(float *)(ray + k * 4 + 0x80) = fVar244;
                          local_8e0 = local_690._0_8_;
                          uStack_8d8 = local_690._8_8_;
                          local_850.valid = (int *)&local_8e0;
                          local_850.geometryUserPtr = pGVar3->userPtr;
                          local_850.context = context->user;
                          local_850.hit = local_660;
                          local_850.N = 4;
                          local_850.ray = (RTCRayN *)ray;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar232 = ZEXT464((uint)fVar237);
                            auVar242 = ZEXT1664(local_800._0_16_);
                            auVar250 = ZEXT1664(auVar154);
                            auVar255 = ZEXT1664(auVar1);
                            auVar257 = ZEXT1664(auVar82);
                            (*pGVar3->occlusionFilterN)(&local_850);
                            auVar240 = ZEXT1664(ZEXT416((uint)fVar244));
                            auVar248 = ZEXT1664(ZEXT416((uint)fVar247));
                            auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar259 = ZEXT3264(auVar96);
                          }
                          auVar62._8_8_ = uStack_8d8;
                          auVar62._0_8_ = local_8e0;
                          uVar74 = vptestmd_avx512vl(auVar62,auVar62);
                          if ((uVar74 & 0xf) == 0) {
                            bVar71 = false;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar232 = ZEXT1664(auVar232._0_16_);
                              auVar242 = ZEXT1664(auVar242._0_16_);
                              auVar250 = ZEXT1664(auVar250._0_16_);
                              auVar255 = ZEXT1664(auVar255._0_16_);
                              auVar257 = ZEXT1664(auVar257._0_16_);
                              (*p_Var4)(&local_850);
                              auVar240 = ZEXT1664(ZEXT416((uint)fVar244));
                              auVar248 = ZEXT1664(ZEXT416((uint)fVar247));
                              auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar259 = ZEXT3264(auVar96);
                            }
                            auVar63._8_8_ = uStack_8d8;
                            auVar63._0_8_ = local_8e0;
                            uVar74 = vptestmd_avx512vl(auVar63,auVar63);
                            uVar74 = uVar74 & 0xf;
                            auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar78 = (bool)((byte)uVar74 & 1);
                            auVar90._0_4_ =
                                 (uint)bVar78 * auVar83._0_4_ |
                                 (uint)!bVar78 * *(int *)(local_850.ray + 0x80);
                            bVar78 = (bool)((byte)(uVar74 >> 1) & 1);
                            auVar90._4_4_ =
                                 (uint)bVar78 * auVar83._4_4_ |
                                 (uint)!bVar78 * *(int *)(local_850.ray + 0x84);
                            bVar78 = (bool)((byte)(uVar74 >> 2) & 1);
                            auVar90._8_4_ =
                                 (uint)bVar78 * auVar83._8_4_ |
                                 (uint)!bVar78 * *(int *)(local_850.ray + 0x88);
                            bVar78 = SUB81(uVar74 >> 3,0);
                            auVar90._12_4_ =
                                 (uint)bVar78 * auVar83._12_4_ |
                                 (uint)!bVar78 * *(int *)(local_850.ray + 0x8c);
                            *(undefined1 (*) [16])(local_850.ray + 0x80) = auVar90;
                            bVar71 = (byte)uVar74 != 0;
                          }
                          if ((bool)bVar71 == false) {
                            *(float *)(ray + k * 4 + 0x80) = fVar245;
                          }
                        }
                        bVar78 = false;
                        goto LAB_01e0cdcd;
                      }
                    }
                    bVar78 = false;
                    bVar71 = 0;
                  }
                }
LAB_01e0cdcd:
                if (!bVar78) goto LAB_01e0d0e3;
                lVar77 = lVar77 + -1;
              } while (lVar77 != 0);
              bVar71 = 0;
LAB_01e0d0e3:
              bVar75 = bVar75 | bVar71 & 1;
              auVar67._4_4_ = fStack_57c;
              auVar67._0_4_ = local_580;
              auVar67._8_4_ = fStack_578;
              auVar67._12_4_ = fStack_574;
              auVar67._16_4_ = fStack_570;
              auVar67._20_4_ = fStack_56c;
              auVar67._24_4_ = fStack_568;
              auVar67._28_4_ = fStack_564;
              uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar26._4_4_ = uVar147;
              auVar26._0_4_ = uVar147;
              auVar26._8_4_ = uVar147;
              auVar26._12_4_ = uVar147;
              auVar26._16_4_ = uVar147;
              auVar26._20_4_ = uVar147;
              auVar26._24_4_ = uVar147;
              auVar26._28_4_ = uVar147;
              uVar12 = vcmpps_avx512vl(auVar67,auVar26,2);
              bVar76 = bVar70 & bVar76 & (byte)uVar12;
            } while (bVar76 != 0);
          }
          uVar13 = vpcmpd_avx512vl(local_520,_local_5a0,1);
          uVar14 = vpcmpd_avx512vl(local_520,local_440,1);
          auVar186._0_4_ = (float)local_5c0._0_4_ + (float)local_1c0._0_4_;
          auVar186._4_4_ = (float)local_5c0._4_4_ + (float)local_1c0._4_4_;
          auVar186._8_4_ = fStack_5b8 + fStack_1b8;
          auVar186._12_4_ = fStack_5b4 + fStack_1b4;
          auVar186._16_4_ = fStack_5b0 + fStack_1b0;
          auVar186._20_4_ = fStack_5ac + fStack_1ac;
          auVar186._24_4_ = fStack_5a8 + fStack_1a8;
          auVar186._28_4_ = fStack_5a4 + fStack_1a4;
          uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar205._4_4_ = uVar147;
          auVar205._0_4_ = uVar147;
          auVar205._8_4_ = uVar147;
          auVar205._12_4_ = uVar147;
          auVar205._16_4_ = uVar147;
          auVar205._20_4_ = uVar147;
          auVar205._24_4_ = uVar147;
          auVar205._28_4_ = uVar147;
          uVar12 = vcmpps_avx512vl(auVar186,auVar205,2);
          bVar76 = (byte)local_8b0 & (byte)uVar14 & (byte)uVar12;
          auVar218._0_4_ = (float)local_5c0._0_4_ + (float)local_480._0_4_;
          auVar218._4_4_ = (float)local_5c0._4_4_ + (float)local_480._4_4_;
          auVar218._8_4_ = fStack_5b8 + fStack_478;
          auVar218._12_4_ = fStack_5b4 + fStack_474;
          auVar218._16_4_ = fStack_5b0 + fStack_470;
          auVar218._20_4_ = fStack_5ac + fStack_46c;
          auVar218._24_4_ = fStack_5a8 + fStack_468;
          auVar218._28_4_ = fStack_5a4 + fStack_464;
          uVar12 = vcmpps_avx512vl(auVar218,auVar205,2);
          bVar69 = bVar69 & (byte)uVar13 & (byte)uVar12 | bVar76;
          prim = local_860;
          if (bVar69 == 0) {
            auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
            auVar206 = ZEXT1664(local_870);
          }
          else {
            local_180[uVar72 * 0x60] = bVar69;
            auVar137._0_4_ =
                 (uint)(bVar76 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar76 & 1) * local_480._0_4_;
            bVar78 = (bool)(bVar76 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar78 * local_1c0._4_4_ | (uint)!bVar78 * local_480._4_4_;
            bVar78 = (bool)(bVar76 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar78 * (int)fStack_1b8 | (uint)!bVar78 * (int)fStack_478;
            bVar78 = (bool)(bVar76 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar78 * (int)fStack_1b4 | (uint)!bVar78 * (int)fStack_474;
            bVar78 = (bool)(bVar76 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar78 * (int)fStack_1b0 | (uint)!bVar78 * (int)fStack_470;
            bVar78 = (bool)(bVar76 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar78 * (int)fStack_1ac | (uint)!bVar78 * (int)fStack_46c;
            bVar78 = (bool)(bVar76 >> 6 & 1);
            auVar137._24_4_ = (uint)bVar78 * (int)fStack_1a8 | (uint)!bVar78 * (int)fStack_468;
            auVar137._28_4_ =
                 (uint)(bVar76 >> 7) * (int)fStack_1a4 |
                 (uint)!(bool)(bVar76 >> 7) * (int)fStack_464;
            *(undefined1 (*) [32])(auStack_160 + uVar72 * 0x60) = auVar137;
            auVar206 = ZEXT1664(local_870);
            uVar12 = vmovlps_avx(local_870);
            *(undefined8 *)(local_140 + uVar72 * 0x18) = uVar12;
            local_138[uVar72 * 0x18] = (int)local_8c0 + 1;
            uVar72 = (ulong)((int)uVar72 + 1);
            auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
          }
        }
      }
    }
    do {
      if ((int)uVar72 == 0) {
        if (bVar75 != 0) {
          return bVar79;
        }
        uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar28._4_4_ = uVar147;
        auVar28._0_4_ = uVar147;
        auVar28._8_4_ = uVar147;
        auVar28._12_4_ = uVar147;
        auVar28._16_4_ = uVar147;
        auVar28._20_4_ = uVar147;
        auVar28._24_4_ = uVar147;
        auVar28._28_4_ = uVar147;
        uVar12 = vcmpps_avx512vl(local_420,auVar28,2);
        uVar80 = (uint)local_858 & (uint)uVar12;
        local_858 = (ulong)uVar80;
        bVar79 = uVar80 != 0;
        if (!bVar79) {
          return bVar79;
        }
        goto LAB_01e0ad2c;
      }
      uVar74 = (ulong)((int)uVar72 - 1);
      lVar77 = uVar74 * 0x60;
      auVar96 = *(undefined1 (*) [32])(auStack_160 + lVar77);
      auVar187._0_4_ = auVar96._0_4_ + (float)local_5c0._0_4_;
      auVar187._4_4_ = auVar96._4_4_ + (float)local_5c0._4_4_;
      auVar187._8_4_ = auVar96._8_4_ + fStack_5b8;
      auVar187._12_4_ = auVar96._12_4_ + fStack_5b4;
      auVar187._16_4_ = auVar96._16_4_ + fStack_5b0;
      auVar187._20_4_ = auVar96._20_4_ + fStack_5ac;
      auVar187._24_4_ = auVar96._24_4_ + fStack_5a8;
      auVar187._28_4_ = auVar96._28_4_ + fStack_5a4;
      uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar27._4_4_ = uVar147;
      auVar27._0_4_ = uVar147;
      auVar27._8_4_ = uVar147;
      auVar27._12_4_ = uVar147;
      auVar27._16_4_ = uVar147;
      auVar27._20_4_ = uVar147;
      auVar27._24_4_ = uVar147;
      auVar27._28_4_ = uVar147;
      uVar12 = vcmpps_avx512vl(auVar187,auVar27,2);
      uVar80 = (uint)uVar12 & (uint)local_180[lVar77];
      bVar69 = (byte)uVar80;
      if (uVar80 != 0) {
        auVar188._8_4_ = 0x7f800000;
        auVar188._0_8_ = 0x7f8000007f800000;
        auVar188._12_4_ = 0x7f800000;
        auVar188._16_4_ = 0x7f800000;
        auVar188._20_4_ = 0x7f800000;
        auVar188._24_4_ = 0x7f800000;
        auVar188._28_4_ = 0x7f800000;
        auVar95 = vblendmps_avx512vl(auVar188,auVar96);
        auVar138._0_4_ =
             (uint)(bVar69 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)auVar96._0_4_;
        bVar78 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar138._4_4_ = (uint)bVar78 * auVar95._4_4_ | (uint)!bVar78 * (int)auVar96._4_4_;
        bVar78 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar138._8_4_ = (uint)bVar78 * auVar95._8_4_ | (uint)!bVar78 * (int)auVar96._8_4_;
        bVar78 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar138._12_4_ = (uint)bVar78 * auVar95._12_4_ | (uint)!bVar78 * (int)auVar96._12_4_;
        bVar78 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar138._16_4_ = (uint)bVar78 * auVar95._16_4_ | (uint)!bVar78 * (int)auVar96._16_4_;
        bVar78 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar138._20_4_ = (uint)bVar78 * auVar95._20_4_ | (uint)!bVar78 * (int)auVar96._20_4_;
        bVar78 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar138._24_4_ = (uint)bVar78 * auVar95._24_4_ | (uint)!bVar78 * (int)auVar96._24_4_;
        auVar138._28_4_ =
             (uVar80 >> 7) * auVar95._28_4_ | (uint)!SUB41(uVar80 >> 7,0) * (int)auVar96._28_4_;
        auVar96 = vshufps_avx(auVar138,auVar138,0xb1);
        auVar96 = vminps_avx(auVar138,auVar96);
        auVar95 = vshufpd_avx(auVar96,auVar96,5);
        auVar96 = vminps_avx(auVar96,auVar95);
        auVar95 = vpermpd_avx2(auVar96,0x4e);
        auVar96 = vminps_avx(auVar96,auVar95);
        uVar12 = vcmpps_avx512vl(auVar138,auVar96,0);
        bVar76 = (byte)uVar12 & bVar69;
        if (bVar76 != 0) {
          uVar80 = (uint)bVar76;
        }
        fVar241 = local_140[uVar74 * 0x18 + 1];
        uVar139 = 0;
        for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
          uVar139 = uVar139 + 1;
        }
        local_8c0 = (ulong)local_138[uVar74 * 0x18];
        bVar76 = ~('\x01' << ((byte)uVar139 & 0x1f)) & bVar69;
        local_180[lVar77] = bVar76;
        uVar73 = uVar74;
        if (bVar76 != 0) {
          uVar73 = uVar72;
        }
        fVar243 = local_140[uVar74 * 0x18];
        auVar189._4_4_ = fVar243;
        auVar189._0_4_ = fVar243;
        auVar189._8_4_ = fVar243;
        auVar189._12_4_ = fVar243;
        auVar189._16_4_ = fVar243;
        auVar189._20_4_ = fVar243;
        auVar189._24_4_ = fVar243;
        auVar189._28_4_ = fVar243;
        fVar241 = fVar241 - fVar243;
        auVar165._4_4_ = fVar241;
        auVar165._0_4_ = fVar241;
        auVar165._8_4_ = fVar241;
        auVar165._12_4_ = fVar241;
        auVar165._16_4_ = fVar241;
        auVar165._20_4_ = fVar241;
        auVar165._24_4_ = fVar241;
        auVar165._28_4_ = fVar241;
        auVar83 = vfmadd132ps_fma(auVar165,auVar189,_DAT_02020f20);
        _local_660 = ZEXT1632(auVar83);
        auVar206 = ZEXT864(*(ulong *)(local_660 + (ulong)uVar139 * 4));
        uVar74 = uVar73;
      }
      uVar72 = uVar74;
    } while (bVar69 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }